

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  RTCFilterFunctionN p_Var18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [28];
  undefined1 auVar87 [28];
  uint uVar88;
  uint uVar89;
  ulong uVar90;
  uint uVar91;
  long lVar92;
  ulong uVar93;
  ulong uVar94;
  long lVar95;
  long lVar96;
  undefined4 uVar97;
  undefined8 unaff_R13;
  long lVar98;
  undefined1 auVar100 [16];
  undefined8 uVar99;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar101 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar119;
  float fVar121;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined8 uVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar162 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar159;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar163 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar168 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar199 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined8 uVar222;
  undefined8 uVar223;
  float fVar224;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [32];
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 local_7f0 [16];
  ulong local_7e0;
  ulong local_7d8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 (*local_6f0) [16];
  Precalculations *local_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  LinearSpace3fa *local_550;
  Primitive *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  int iStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar90 = (ulong)(byte)PVar13;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar90 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar171);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar90 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar174);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar90 * 6 + 6);
  auVar164 = vpmovsxbd_avx2(auVar162);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar90 * 0xf + 6);
  auVar102 = vpmovsxbd_avx2(auVar7);
  lVar92 = uVar90 * 0x25;
  auVar129._1_3_ = 0;
  auVar129[0] = PVar13;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar115 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar90 * 0x11 + 6);
  auVar157 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar90 * 0x1a + 6);
  auVar103 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar90 * 0x1b + 6);
  auVar111 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar90 * 0x1c + 6);
  auVar139 = vpmovsxbd_avx2(auVar12);
  auVar171 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar171 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  fVar146 = *(float *)(prim + lVar92 + 0x12);
  auVar174 = vsubps_avx(auVar171,*(undefined1 (*) [16])(prim + lVar92 + 6));
  fVar159 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar92 + 0x16)) *
            *(float *)(prim + lVar92 + 0x1a);
  auVar171 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar171 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar193._0_4_ = fVar146 * auVar174._0_4_;
  auVar193._4_4_ = fVar146 * auVar174._4_4_;
  auVar193._8_4_ = fVar146 * auVar174._8_4_;
  auVar193._12_4_ = fVar146 * auVar174._12_4_;
  auVar214._0_4_ = fVar146 * auVar171._0_4_;
  auVar214._4_4_ = fVar146 * auVar171._4_4_;
  auVar214._8_4_ = fVar146 * auVar171._8_4_;
  auVar214._12_4_ = fVar146 * auVar171._12_4_;
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar136 = vcvtdq2ps_avx(auVar139);
  auVar171 = vmovshdup_avx(auVar214);
  auVar179._0_8_ = auVar171._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  auVar179._16_8_ = auVar179._0_8_;
  auVar179._24_8_ = auVar179._0_8_;
  auVar171 = vshufps_avx(auVar214,auVar214,0xaa);
  fVar146 = auVar171._0_4_;
  auVar209._0_4_ = fVar146 * auVar164._0_4_;
  fVar119 = auVar171._4_4_;
  auVar209._4_4_ = fVar119 * auVar164._4_4_;
  auVar209._8_4_ = fVar146 * auVar164._8_4_;
  auVar209._12_4_ = fVar119 * auVar164._12_4_;
  auVar209._16_4_ = fVar146 * auVar164._16_4_;
  auVar209._20_4_ = fVar119 * auVar164._20_4_;
  auVar209._24_4_ = fVar146 * auVar164._24_4_;
  auVar209._28_4_ = 0;
  auVar105._4_4_ = fVar119 * auVar157._4_4_;
  auVar105._0_4_ = fVar146 * auVar157._0_4_;
  auVar105._8_4_ = fVar146 * auVar157._8_4_;
  auVar105._12_4_ = fVar119 * auVar157._12_4_;
  auVar105._16_4_ = fVar146 * auVar157._16_4_;
  auVar105._20_4_ = fVar119 * auVar157._20_4_;
  auVar105._24_4_ = fVar146 * auVar157._24_4_;
  auVar105._28_4_ = auVar139._28_4_;
  auVar139._4_4_ = fVar119 * auVar136._4_4_;
  auVar139._0_4_ = fVar146 * auVar136._0_4_;
  auVar139._8_4_ = fVar146 * auVar136._8_4_;
  auVar139._12_4_ = fVar119 * auVar136._12_4_;
  auVar139._16_4_ = fVar146 * auVar136._16_4_;
  auVar139._20_4_ = fVar119 * auVar136._20_4_;
  auVar139._24_4_ = fVar146 * auVar136._24_4_;
  auVar139._28_4_ = fVar119;
  auVar174 = vfmadd231ps_fma(auVar209,auVar179,auVar107);
  auVar162 = vfmadd231ps_fma(auVar105,auVar179,auVar115);
  auVar7 = vfmadd231ps_fma(auVar139,auVar111,auVar179);
  auVar171 = vshufps_avx(auVar193,auVar193,0xaa);
  fVar146 = auVar171._0_4_;
  auVar180._0_4_ = fVar146 * auVar164._0_4_;
  fVar119 = auVar171._4_4_;
  auVar180._4_4_ = fVar119 * auVar164._4_4_;
  auVar180._8_4_ = fVar146 * auVar164._8_4_;
  auVar180._12_4_ = fVar119 * auVar164._12_4_;
  auVar180._16_4_ = fVar146 * auVar164._16_4_;
  auVar180._20_4_ = fVar119 * auVar164._20_4_;
  auVar180._24_4_ = fVar146 * auVar164._24_4_;
  auVar180._28_4_ = 0;
  auVar131._4_4_ = fVar119 * auVar157._4_4_;
  auVar131._0_4_ = fVar146 * auVar157._0_4_;
  auVar131._8_4_ = fVar146 * auVar157._8_4_;
  auVar131._12_4_ = fVar119 * auVar157._12_4_;
  auVar131._16_4_ = fVar146 * auVar157._16_4_;
  auVar131._20_4_ = fVar119 * auVar157._20_4_;
  auVar131._24_4_ = fVar146 * auVar157._24_4_;
  auVar131._28_4_ = auVar164._28_4_;
  auVar164._4_4_ = fVar119 * auVar136._4_4_;
  auVar164._0_4_ = fVar146 * auVar136._0_4_;
  auVar164._8_4_ = fVar146 * auVar136._8_4_;
  auVar164._12_4_ = fVar119 * auVar136._12_4_;
  auVar164._16_4_ = fVar146 * auVar136._16_4_;
  auVar164._20_4_ = fVar119 * auVar136._20_4_;
  auVar164._24_4_ = fVar146 * auVar136._24_4_;
  auVar164._28_4_ = auVar136._28_4_;
  auVar171 = vmovshdup_avx(auVar193);
  uVar99 = auVar171._0_8_;
  auVar234._8_8_ = uVar99;
  auVar234._0_8_ = uVar99;
  auVar234._16_8_ = uVar99;
  auVar234._24_8_ = uVar99;
  auVar171 = vfmadd231ps_fma(auVar180,auVar234,auVar107);
  auVar157 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 7 + 6));
  auVar8 = vfmadd231ps_fma(auVar131,auVar234,auVar115);
  auVar139 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0xb + 6));
  auVar9 = vfmadd231ps_fma(auVar164,auVar234,auVar111);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 9 + 6));
  auVar131 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0xd + 6));
  auVar107 = vcvtdq2ps_avx(auVar114);
  auVar164 = vcvtdq2ps_avx(auVar102);
  auVar115 = vcvtdq2ps_avx(auVar103);
  auVar190._4_4_ = auVar214._0_4_;
  auVar190._0_4_ = auVar214._0_4_;
  auVar190._8_4_ = auVar214._0_4_;
  auVar190._12_4_ = auVar214._0_4_;
  auVar190._16_4_ = auVar214._0_4_;
  auVar190._20_4_ = auVar214._0_4_;
  auVar190._24_4_ = auVar214._0_4_;
  auVar190._28_4_ = auVar214._0_4_;
  auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar190,auVar107);
  auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar190,auVar164);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar115,auVar190);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x12 + 6));
  auVar191._4_4_ = auVar193._0_4_;
  auVar191._0_4_ = auVar193._0_4_;
  auVar191._8_4_ = auVar193._0_4_;
  auVar191._12_4_ = auVar193._0_4_;
  auVar191._16_4_ = auVar193._0_4_;
  auVar191._20_4_ = auVar193._0_4_;
  auVar191._24_4_ = auVar193._0_4_;
  auVar191._28_4_ = auVar193._0_4_;
  auVar193 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar191,auVar107);
  auVar214 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar191,auVar164);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar191,auVar115);
  local_160._8_4_ = 0x7fffffff;
  local_160._0_8_ = 0x7fffffff7fffffff;
  local_160._12_4_ = 0x7fffffff;
  local_160._16_4_ = 0x7fffffff;
  local_160._20_4_ = 0x7fffffff;
  local_160._24_4_ = 0x7fffffff;
  local_160._28_4_ = 0x7fffffff;
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar174),local_160);
  auVar107 = vcmpps_avx(auVar107,auVar102,1);
  auVar164 = vblendvps_avx(ZEXT1632(auVar174),auVar102,auVar107);
  auVar107 = vandps_avx(ZEXT1632(auVar162),local_160);
  auVar107 = vcmpps_avx(auVar107,auVar102,1);
  auVar115 = vblendvps_avx(ZEXT1632(auVar162),auVar102,auVar107);
  auVar107 = vandps_avx(ZEXT1632(auVar7),local_160);
  auVar107 = vcmpps_avx(auVar107,auVar102,1);
  auVar107 = vblendvps_avx(ZEXT1632(auVar7),auVar102,auVar107);
  auVar136 = vrcpps_avx(auVar164);
  auVar196._4_4_ = fVar159;
  auVar196._0_4_ = fVar159;
  auVar196._8_4_ = fVar159;
  auVar196._12_4_ = fVar159;
  auVar196._16_4_ = fVar159;
  auVar196._20_4_ = fVar159;
  auVar196._24_4_ = fVar159;
  auVar196._28_4_ = fVar159;
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar111 = vcvtdq2ps_avx(auVar139);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar7 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar157 = vcvtdq2ps_avx(auVar105);
  auVar111 = vcvtdq2ps_avx(auVar131);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar8 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar157 = vcvtdq2ps_avx(auVar114);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x16 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar9 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar157 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x14 + 6));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x18 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar10 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar157 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x1d + 6));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x21 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar11 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar157 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x1f + 6));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar90 * 0x23 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar157);
  auVar12 = vfmadd213ps_fma(auVar111,auVar196,auVar157);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = 0x3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar235._16_4_ = 0x3f800000;
  auVar235._20_4_ = 0x3f800000;
  auVar235._24_4_ = 0x3f800000;
  auVar235._28_4_ = 0x3f800000;
  auVar171 = vfnmadd213ps_fma(auVar164,auVar136,auVar235);
  auVar164 = vrcpps_avx(auVar115);
  auVar171 = vfmadd132ps_fma(ZEXT1632(auVar171),auVar136,auVar136);
  auVar174 = vfnmadd213ps_fma(auVar115,auVar164,auVar235);
  auVar174 = vfmadd132ps_fma(ZEXT1632(auVar174),auVar164,auVar164);
  auVar164 = vrcpps_avx(auVar107);
  auVar162 = vfnmadd213ps_fma(auVar107,auVar164,auVar235);
  auVar162 = vfmadd132ps_fma(ZEXT1632(auVar162),auVar164,auVar164);
  auVar107 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar193));
  auVar115._4_4_ = auVar171._4_4_ * auVar107._4_4_;
  auVar115._0_4_ = auVar171._0_4_ * auVar107._0_4_;
  auVar115._8_4_ = auVar171._8_4_ * auVar107._8_4_;
  auVar115._12_4_ = auVar171._12_4_ * auVar107._12_4_;
  auVar115._16_4_ = auVar107._16_4_ * 0.0;
  auVar115._20_4_ = auVar107._20_4_ * 0.0;
  auVar115._24_4_ = auVar107._24_4_ * 0.0;
  auVar115._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar193));
  auVar157._4_4_ = auVar171._4_4_ * auVar107._4_4_;
  auVar157._0_4_ = auVar171._0_4_ * auVar107._0_4_;
  auVar157._8_4_ = auVar171._8_4_ * auVar107._8_4_;
  auVar157._12_4_ = auVar171._12_4_ * auVar107._12_4_;
  auVar157._16_4_ = auVar107._16_4_ * 0.0;
  auVar157._20_4_ = auVar107._20_4_ * 0.0;
  auVar157._24_4_ = auVar107._24_4_ * 0.0;
  auVar157._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar214));
  auVar111._4_4_ = auVar174._4_4_ * auVar107._4_4_;
  auVar111._0_4_ = auVar174._0_4_ * auVar107._0_4_;
  auVar111._8_4_ = auVar174._8_4_ * auVar107._8_4_;
  auVar111._12_4_ = auVar174._12_4_ * auVar107._12_4_;
  auVar111._16_4_ = auVar107._16_4_ * 0.0;
  auVar111._20_4_ = auVar107._20_4_ * 0.0;
  auVar111._24_4_ = auVar107._24_4_ * 0.0;
  auVar111._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar214));
  auVar128._0_4_ = auVar174._0_4_ * auVar107._0_4_;
  auVar128._4_4_ = auVar174._4_4_ * auVar107._4_4_;
  auVar128._8_4_ = auVar174._8_4_ * auVar107._8_4_;
  auVar128._12_4_ = auVar174._12_4_ * auVar107._12_4_;
  auVar128._16_4_ = auVar107._16_4_ * 0.0;
  auVar128._20_4_ = auVar107._20_4_ * 0.0;
  auVar128._24_4_ = auVar107._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar107 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar100));
  auVar136._4_4_ = auVar162._4_4_ * auVar107._4_4_;
  auVar136._0_4_ = auVar162._0_4_ * auVar107._0_4_;
  auVar136._8_4_ = auVar162._8_4_ * auVar107._8_4_;
  auVar136._12_4_ = auVar162._12_4_ * auVar107._12_4_;
  auVar136._16_4_ = auVar107._16_4_ * 0.0;
  auVar136._20_4_ = auVar107._20_4_ * 0.0;
  auVar136._24_4_ = auVar107._24_4_ * 0.0;
  auVar136._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar100));
  auVar103._0_4_ = auVar162._0_4_ * auVar107._0_4_;
  auVar103._4_4_ = auVar162._4_4_ * auVar107._4_4_;
  auVar103._8_4_ = auVar162._8_4_ * auVar107._8_4_;
  auVar103._12_4_ = auVar162._12_4_ * auVar107._12_4_;
  auVar103._16_4_ = auVar107._16_4_ * 0.0;
  auVar103._20_4_ = auVar107._20_4_ * 0.0;
  auVar103._24_4_ = auVar107._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar107 = vpminsd_avx2(auVar115,auVar157);
  auVar164 = vpminsd_avx2(auVar111,auVar128);
  auVar107 = vmaxps_avx(auVar107,auVar164);
  auVar164 = vpminsd_avx2(auVar136,auVar103);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar204._4_4_ = uVar97;
  auVar204._0_4_ = uVar97;
  auVar204._8_4_ = uVar97;
  auVar204._12_4_ = uVar97;
  auVar204._16_4_ = uVar97;
  auVar204._20_4_ = uVar97;
  auVar204._24_4_ = uVar97;
  auVar204._28_4_ = uVar97;
  auVar164 = vmaxps_avx(auVar164,auVar204);
  auVar107 = vmaxps_avx(auVar107,auVar164);
  local_80._4_4_ = auVar107._4_4_ * 0.99999964;
  local_80._0_4_ = auVar107._0_4_ * 0.99999964;
  local_80._8_4_ = auVar107._8_4_ * 0.99999964;
  local_80._12_4_ = auVar107._12_4_ * 0.99999964;
  local_80._16_4_ = auVar107._16_4_ * 0.99999964;
  local_80._20_4_ = auVar107._20_4_ * 0.99999964;
  local_80._24_4_ = auVar107._24_4_ * 0.99999964;
  local_80._28_4_ = auVar107._28_4_;
  auVar107 = vpmaxsd_avx2(auVar115,auVar157);
  auVar164 = vpmaxsd_avx2(auVar111,auVar128);
  auVar107 = vminps_avx(auVar107,auVar164);
  auVar164 = vpmaxsd_avx2(auVar136,auVar103);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar163._4_4_ = uVar97;
  auVar163._0_4_ = uVar97;
  auVar163._8_4_ = uVar97;
  auVar163._12_4_ = uVar97;
  auVar163._16_4_ = uVar97;
  auVar163._20_4_ = uVar97;
  auVar163._24_4_ = uVar97;
  auVar163._28_4_ = uVar97;
  auVar164 = vminps_avx(auVar164,auVar163);
  auVar107 = vminps_avx(auVar107,auVar164);
  auVar114._4_4_ = auVar107._4_4_ * 1.0000004;
  auVar114._0_4_ = auVar107._0_4_ * 1.0000004;
  auVar114._8_4_ = auVar107._8_4_ * 1.0000004;
  auVar114._12_4_ = auVar107._12_4_ * 1.0000004;
  auVar114._16_4_ = auVar107._16_4_ * 1.0000004;
  auVar114._20_4_ = auVar107._20_4_ * 1.0000004;
  auVar114._24_4_ = auVar107._24_4_ * 1.0000004;
  auVar114._28_4_ = auVar107._28_4_;
  auVar129[4] = PVar13;
  auVar129._5_3_ = 0;
  auVar129[8] = PVar13;
  auVar129._9_3_ = 0;
  auVar129[0xc] = PVar13;
  auVar129._13_3_ = 0;
  auVar129[0x10] = PVar13;
  auVar129._17_3_ = 0;
  auVar129[0x14] = PVar13;
  auVar129._21_3_ = 0;
  auVar129[0x18] = PVar13;
  auVar129._25_3_ = 0;
  auVar129[0x1c] = PVar13;
  auVar129._29_3_ = 0;
  auVar107 = vcmpps_avx(local_80,auVar114,2);
  auVar164 = vpcmpgtd_avx2(auVar129,_DAT_01fb4ba0);
  auVar107 = vandps_avx(auVar107,auVar164);
  uVar97 = vmovmskps_avx(auVar107);
  uVar90 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar97);
  local_550 = pre->ray_space + k;
  local_540 = mm_lookupmask_ps._16_8_;
  uStack_538 = mm_lookupmask_ps._24_8_;
  uStack_530 = mm_lookupmask_ps._16_8_;
  uStack_528 = mm_lookupmask_ps._24_8_;
  local_6f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_6e8 = pre;
  local_548 = prim;
  do {
    auVar107 = local_500;
    if (uVar90 == 0) {
      return;
    }
    lVar92 = 0;
    for (uVar94 = uVar90; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
      lVar92 = lVar92 + 1;
    }
    uVar89 = *(uint *)(local_548 + 2);
    local_7d8 = (ulong)uVar89;
    uVar14 = *(uint *)(local_548 + lVar92 * 4 + 6);
    uVar94 = (ulong)uVar14;
    pGVar16 = (context->scene->geometries).items[local_7d8].ptr;
    uVar93 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                             uVar94 * pGVar16[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar146 = (pGVar16->time_range).lower;
    fVar146 = pGVar16->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar146) / ((pGVar16->time_range).upper - fVar146))
    ;
    auVar171 = vroundss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),9);
    auVar171 = vminss_avx(auVar171,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
    auVar171 = vmaxss_avx(ZEXT816(0) << 0x20,auVar171);
    fVar146 = fVar146 - auVar171._0_4_;
    _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar96 = (long)(int)auVar171._0_4_ * 0x38;
    lVar92 = *(long *)(_Var17 + 0x10 + lVar96);
    lVar98 = *(long *)(_Var17 + 0x38 + lVar96);
    lVar95 = *(long *)(_Var17 + 0x48 + lVar96);
    pfVar1 = (float *)(lVar98 + uVar93 * lVar95);
    auVar203._0_4_ = fVar146 * *pfVar1;
    auVar203._4_4_ = fVar146 * pfVar1[1];
    auVar203._8_4_ = fVar146 * pfVar1[2];
    auVar203._12_4_ = fVar146 * pfVar1[3];
    pfVar1 = (float *)(lVar98 + (uVar93 + 1) * lVar95);
    auVar147._0_4_ = fVar146 * *pfVar1;
    auVar147._4_4_ = fVar146 * pfVar1[1];
    auVar147._8_4_ = fVar146 * pfVar1[2];
    auVar147._12_4_ = fVar146 * pfVar1[3];
    pfVar1 = (float *)(lVar98 + (uVar93 + 2) * lVar95);
    auVar160._0_4_ = fVar146 * *pfVar1;
    auVar160._4_4_ = fVar146 * pfVar1[1];
    auVar160._8_4_ = fVar146 * pfVar1[2];
    auVar160._12_4_ = fVar146 * pfVar1[3];
    pfVar1 = (float *)(lVar98 + lVar95 * (uVar93 + 3));
    auVar168._0_4_ = fVar146 * *pfVar1;
    auVar168._4_4_ = fVar146 * pfVar1[1];
    auVar168._8_4_ = fVar146 * pfVar1[2];
    auVar168._12_4_ = fVar146 * pfVar1[3];
    lVar98 = *(long *)(_Var17 + lVar96);
    fVar146 = 1.0 - fVar146;
    auVar100._4_4_ = fVar146;
    auVar100._0_4_ = fVar146;
    auVar100._8_4_ = fVar146;
    auVar100._12_4_ = fVar146;
    auVar9 = vfmadd231ps_fma(auVar203,auVar100,*(undefined1 (*) [16])(lVar98 + lVar92 * uVar93));
    auVar10 = vfmadd231ps_fma(auVar147,auVar100,
                              *(undefined1 (*) [16])(lVar98 + lVar92 * (uVar93 + 1)));
    auVar11 = vfmadd231ps_fma(auVar160,auVar100,
                              *(undefined1 (*) [16])(lVar98 + lVar92 * (uVar93 + 2)));
    auVar12 = vfmadd231ps_fma(auVar168,auVar100,
                              *(undefined1 (*) [16])(lVar98 + lVar92 * (uVar93 + 3)));
    iVar15 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar171 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar7 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar174 = vsubps_avx(auVar9,auVar7);
    uVar97 = auVar174._0_4_;
    auVar161._4_4_ = uVar97;
    auVar161._0_4_ = uVar97;
    auVar161._8_4_ = uVar97;
    auVar161._12_4_ = uVar97;
    auVar171 = vshufps_avx(auVar174,auVar174,0x55);
    auVar174 = vshufps_avx(auVar174,auVar174,0xaa);
    aVar5 = (local_550->vx).field_0;
    aVar6 = (local_550->vy).field_0;
    fVar146 = (local_550->vz).field_0.m128[0];
    fVar159 = *(float *)((long)&(local_550->vz).field_0 + 4);
    fVar119 = *(float *)((long)&(local_550->vz).field_0 + 8);
    fVar19 = *(float *)((long)&(local_550->vz).field_0 + 0xc);
    auVar188._0_4_ = fVar146 * auVar174._0_4_;
    auVar188._4_4_ = fVar159 * auVar174._4_4_;
    auVar188._8_4_ = fVar119 * auVar174._8_4_;
    auVar188._12_4_ = fVar19 * auVar174._12_4_;
    auVar171 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar6,auVar171);
    auVar193 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar161);
    auVar171 = vblendps_avx(auVar193,auVar9,8);
    auVar162 = vsubps_avx(auVar10,auVar7);
    uVar97 = auVar162._0_4_;
    auVar189._4_4_ = uVar97;
    auVar189._0_4_ = uVar97;
    auVar189._8_4_ = uVar97;
    auVar189._12_4_ = uVar97;
    auVar174 = vshufps_avx(auVar162,auVar162,0x55);
    auVar162 = vshufps_avx(auVar162,auVar162,0xaa);
    auVar208._0_4_ = fVar146 * auVar162._0_4_;
    auVar208._4_4_ = fVar159 * auVar162._4_4_;
    auVar208._8_4_ = fVar119 * auVar162._8_4_;
    auVar208._12_4_ = fVar19 * auVar162._12_4_;
    auVar174 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar174);
    auVar214 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar189);
    auVar174 = vblendps_avx(auVar214,auVar10,8);
    auVar8 = vsubps_avx(auVar11,auVar7);
    uVar97 = auVar8._0_4_;
    auVar194._4_4_ = uVar97;
    auVar194._0_4_ = uVar97;
    auVar194._8_4_ = uVar97;
    auVar194._12_4_ = uVar97;
    auVar162 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar215._0_4_ = fVar146 * auVar8._0_4_;
    auVar215._4_4_ = fVar159 * auVar8._4_4_;
    auVar215._8_4_ = fVar119 * auVar8._8_4_;
    auVar215._12_4_ = fVar19 * auVar8._12_4_;
    auVar162 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar6,auVar162);
    auVar100 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar5,auVar194);
    auVar162 = vblendps_avx(auVar100,auVar11,8);
    auVar8 = vsubps_avx(auVar12,auVar7);
    uVar97 = auVar8._0_4_;
    auVar195._4_4_ = uVar97;
    auVar195._0_4_ = uVar97;
    auVar195._8_4_ = uVar97;
    auVar195._12_4_ = uVar97;
    auVar7 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar217._0_4_ = fVar146 * auVar8._0_4_;
    auVar217._4_4_ = fVar159 * auVar8._4_4_;
    auVar217._8_4_ = fVar119 * auVar8._8_4_;
    auVar217._12_4_ = fVar19 * auVar8._12_4_;
    auVar7 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar6,auVar7);
    auVar147 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar5,auVar195);
    auVar101._8_4_ = 0x7fffffff;
    auVar101._0_8_ = 0x7fffffff7fffffff;
    auVar101._12_4_ = 0x7fffffff;
    auVar7 = vblendps_avx(auVar147,auVar12,8);
    auVar171 = vandps_avx(auVar171,auVar101);
    auVar174 = vandps_avx(auVar174,auVar101);
    auVar8 = vmaxps_avx(auVar171,auVar174);
    auVar171 = vandps_avx(auVar162,auVar101);
    auVar174 = vandps_avx(auVar7,auVar101);
    auVar171 = vmaxps_avx(auVar171,auVar174);
    auVar171 = vmaxps_avx(auVar8,auVar171);
    auVar174 = vmovshdup_avx(auVar171);
    auVar174 = vmaxss_avx(auVar174,auVar171);
    auVar171 = vshufpd_avx(auVar171,auVar171,1);
    auVar171 = vmaxss_avx(auVar171,auVar174);
    lVar92 = (long)iVar15;
    lVar98 = lVar92 * 0x44;
    auVar174 = vmovshdup_avx(auVar193);
    uVar99 = auVar174._0_8_;
    local_440._8_8_ = uVar99;
    local_440._0_8_ = uVar99;
    local_440._16_8_ = uVar99;
    local_440._24_8_ = uVar99;
    auVar162 = vmovshdup_avx(auVar214);
    uVar99 = auVar162._0_8_;
    local_4a0._8_8_ = uVar99;
    local_4a0._0_8_ = uVar99;
    local_4a0._16_8_ = uVar99;
    local_4a0._24_8_ = uVar99;
    auVar164 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 + 0x908);
    uVar97 = auVar100._0_4_;
    local_5a0._4_4_ = uVar97;
    local_5a0._0_4_ = uVar97;
    local_5a0._8_4_ = uVar97;
    local_5a0._12_4_ = uVar97;
    local_5a0._16_4_ = uVar97;
    local_5a0._20_4_ = uVar97;
    local_5a0._24_4_ = uVar97;
    local_5a0._28_4_ = uVar97;
    auVar162 = vmovshdup_avx(auVar100);
    uVar99 = auVar162._0_8_;
    local_760._8_8_ = uVar99;
    local_760._0_8_ = uVar99;
    local_760._16_8_ = uVar99;
    local_760._24_8_ = uVar99;
    fVar82 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar98 + 0xd8c);
    fVar83 = *(float *)(bspline_basis0 + lVar98 + 0xd90);
    fVar84 = *(float *)(bspline_basis0 + lVar98 + 0xd94);
    fVar120 = *(float *)(bspline_basis0 + lVar98 + 0xd98);
    fVar121 = *(float *)(bspline_basis0 + lVar98 + 0xd9c);
    fVar122 = *(float *)(bspline_basis0 + lVar98 + 0xda0);
    fVar123 = *(float *)(bspline_basis0 + lVar98 + 0xda4);
    auVar86 = *(undefined1 (*) [28])(bspline_basis0 + lVar98 + 0xd8c);
    auVar162 = vmovshdup_avx(auVar147);
    local_620 = auVar162._0_8_;
    local_640 = auVar147._0_4_;
    auVar130._0_4_ = fVar82 * local_640;
    auVar130._4_4_ = fVar83 * local_640;
    auVar130._8_4_ = fVar84 * local_640;
    auVar130._12_4_ = fVar120 * local_640;
    auVar130._16_4_ = fVar121 * local_640;
    auVar130._20_4_ = fVar122 * local_640;
    auVar130._24_4_ = fVar123 * local_640;
    auVar130._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar130,auVar164,local_5a0);
    fVar146 = auVar162._0_4_;
    auVar104._0_4_ = fVar82 * fVar146;
    fVar119 = auVar162._4_4_;
    auVar104._4_4_ = fVar83 * fVar119;
    auVar104._8_4_ = fVar84 * fVar146;
    auVar104._12_4_ = fVar120 * fVar119;
    auVar104._16_4_ = fVar121 * fVar146;
    auVar104._20_4_ = fVar122 * fVar119;
    auVar104._24_4_ = fVar123 * fVar146;
    auVar104._28_4_ = 0;
    auVar162 = vfmadd231ps_fma(auVar104,auVar164,local_760);
    auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 + 0x484);
    uVar97 = auVar214._0_4_;
    local_660._4_4_ = uVar97;
    local_660._0_4_ = uVar97;
    local_660._8_4_ = uVar97;
    local_660._12_4_ = uVar97;
    local_660._16_4_ = uVar97;
    local_660._20_4_ = uVar97;
    local_660._24_4_ = uVar97;
    local_660._28_4_ = uVar97;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar115,local_660);
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar115,local_4a0);
    auVar157 = *(undefined1 (*) [32])(bspline_basis0 + lVar98);
    uVar97 = auVar193._0_4_;
    auVar225._4_4_ = uVar97;
    auVar225._0_4_ = uVar97;
    auVar225._8_4_ = uVar97;
    auVar225._12_4_ = uVar97;
    auVar225._16_4_ = uVar97;
    auVar225._20_4_ = uVar97;
    auVar225._24_4_ = uVar97;
    auVar225._28_4_ = uVar97;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar157,auVar225);
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar157,local_440);
    auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 + 0x908);
    fVar124 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar98 + 0xd8c);
    fVar200 = *(float *)(bspline_basis1 + lVar98 + 0xd90);
    fVar201 = *(float *)(bspline_basis1 + lVar98 + 0xd94);
    fVar202 = *(float *)(bspline_basis1 + lVar98 + 0xd98);
    fVar211 = *(float *)(bspline_basis1 + lVar98 + 0xd9c);
    fVar212 = *(float *)(bspline_basis1 + lVar98 + 0xda0);
    fVar213 = *(float *)(bspline_basis1 + lVar98 + 0xda4);
    auVar87 = *(undefined1 (*) [28])(bspline_basis1 + lVar98 + 0xd8c);
    auVar20._4_4_ = fVar200 * local_640;
    auVar20._0_4_ = fVar124 * local_640;
    auVar20._8_4_ = fVar201 * local_640;
    auVar20._12_4_ = fVar202 * local_640;
    auVar20._16_4_ = fVar211 * local_640;
    auVar20._20_4_ = fVar212 * local_640;
    auVar20._24_4_ = fVar213 * local_640;
    auVar20._28_4_ = local_640;
    auVar8 = vfmadd231ps_fma(auVar20,auVar111,local_5a0);
    auVar21._4_4_ = fVar200 * fVar119;
    auVar21._0_4_ = fVar124 * fVar146;
    auVar21._8_4_ = fVar201 * fVar146;
    auVar21._12_4_ = fVar202 * fVar119;
    auVar21._16_4_ = fVar211 * fVar146;
    auVar21._20_4_ = fVar212 * fVar119;
    auVar21._24_4_ = fVar213 * fVar146;
    auVar21._28_4_ = fVar119;
    auVar101 = vfmadd231ps_fma(auVar21,auVar111,local_760);
    auVar136 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 + 0x484);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar136,local_660);
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar136,local_4a0);
    auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar98);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar114,auVar225);
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar114,local_440);
    auVar128 = ZEXT1632(auVar8);
    auVar131 = ZEXT1632(auVar7);
    auVar103 = vsubps_avx(auVar128,auVar131);
    local_2e0 = ZEXT1632(auVar101);
    auVar105 = ZEXT1632(auVar162);
    _local_300 = vsubps_avx(local_2e0,auVar105);
    auVar106._0_4_ = auVar103._0_4_ * auVar162._0_4_;
    auVar106._4_4_ = auVar103._4_4_ * auVar162._4_4_;
    auVar106._8_4_ = auVar103._8_4_ * auVar162._8_4_;
    auVar106._12_4_ = auVar103._12_4_ * auVar162._12_4_;
    auVar106._16_4_ = auVar103._16_4_ * 0.0;
    auVar106._20_4_ = auVar103._20_4_ * 0.0;
    auVar106._24_4_ = auVar103._24_4_ * 0.0;
    auVar106._28_4_ = 0;
    fVar224 = local_300._0_4_;
    auVar132._0_4_ = fVar224 * auVar7._0_4_;
    fVar228 = local_300._4_4_;
    auVar132._4_4_ = fVar228 * auVar7._4_4_;
    fVar229 = local_300._8_4_;
    auVar132._8_4_ = fVar229 * auVar7._8_4_;
    fVar230 = local_300._12_4_;
    auVar132._12_4_ = fVar230 * auVar7._12_4_;
    fVar231 = local_300._16_4_;
    auVar132._16_4_ = fVar231 * 0.0;
    fVar232 = local_300._20_4_;
    auVar132._20_4_ = fVar232 * 0.0;
    fVar233 = local_300._24_4_;
    auVar132._24_4_ = fVar233 * 0.0;
    auVar132._28_4_ = 0;
    auVar139 = vsubps_avx(auVar106,auVar132);
    auVar162 = vpermilps_avx(auVar9,0xff);
    uVar99 = auVar162._0_8_;
    local_a0._8_8_ = uVar99;
    local_a0._0_8_ = uVar99;
    local_a0._16_8_ = uVar99;
    local_a0._24_8_ = uVar99;
    auVar7 = vpermilps_avx(auVar10,0xff);
    uVar99 = auVar7._0_8_;
    local_c0._8_8_ = uVar99;
    local_c0._0_8_ = uVar99;
    local_c0._16_8_ = uVar99;
    local_c0._24_8_ = uVar99;
    auVar7 = vpermilps_avx(auVar11,0xff);
    uVar99 = auVar7._0_8_;
    local_e0._8_8_ = uVar99;
    local_e0._0_8_ = uVar99;
    local_e0._16_8_ = uVar99;
    local_e0._24_8_ = uVar99;
    auVar7 = vpermilps_avx(auVar12,0xff);
    uVar99 = auVar7._0_8_;
    fVar159 = auVar7._0_4_;
    fVar19 = auVar7._4_4_;
    auVar22._4_4_ = fVar83 * fVar19;
    auVar22._0_4_ = fVar82 * fVar159;
    auVar22._8_4_ = fVar84 * fVar159;
    auVar22._12_4_ = fVar120 * fVar19;
    auVar22._16_4_ = fVar121 * fVar159;
    auVar22._20_4_ = fVar122 * fVar19;
    auVar22._24_4_ = fVar123 * fVar159;
    auVar22._28_4_ = *(undefined4 *)(bspline_basis0 + lVar98 + 0xda8);
    auVar7 = vfmadd231ps_fma(auVar22,local_e0,auVar164);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar115,local_c0);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar157,local_a0);
    auVar23._4_4_ = fVar200 * fVar19;
    auVar23._0_4_ = fVar124 * fVar159;
    auVar23._8_4_ = fVar201 * fVar159;
    auVar23._12_4_ = fVar202 * fVar19;
    auVar23._16_4_ = fVar211 * fVar159;
    auVar23._20_4_ = fVar212 * fVar19;
    auVar23._24_4_ = fVar213 * fVar159;
    auVar23._28_4_ = auVar157._28_4_;
    auVar7 = vfmadd231ps_fma(auVar23,auVar111,local_e0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar136,local_c0);
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar114,local_a0);
    auVar24._4_4_ = fVar228 * fVar228;
    auVar24._0_4_ = fVar224 * fVar224;
    auVar24._8_4_ = fVar229 * fVar229;
    auVar24._12_4_ = fVar230 * fVar230;
    auVar24._16_4_ = fVar231 * fVar231;
    auVar24._20_4_ = fVar232 * fVar232;
    auVar24._24_4_ = fVar233 * fVar233;
    auVar24._28_4_ = auVar162._4_4_;
    auVar162 = vfmadd231ps_fma(auVar24,auVar103,auVar103);
    auVar102 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar101));
    auVar25._4_4_ = auVar102._4_4_ * auVar102._4_4_ * auVar162._4_4_;
    auVar25._0_4_ = auVar102._0_4_ * auVar102._0_4_ * auVar162._0_4_;
    auVar25._8_4_ = auVar102._8_4_ * auVar102._8_4_ * auVar162._8_4_;
    auVar25._12_4_ = auVar102._12_4_ * auVar102._12_4_ * auVar162._12_4_;
    auVar25._16_4_ = auVar102._16_4_ * auVar102._16_4_ * 0.0;
    auVar25._20_4_ = auVar102._20_4_ * auVar102._20_4_ * 0.0;
    auVar25._24_4_ = auVar102._24_4_ * auVar102._24_4_ * 0.0;
    auVar25._28_4_ = auVar102._28_4_;
    auVar26._4_4_ = auVar139._4_4_ * auVar139._4_4_;
    auVar26._0_4_ = auVar139._0_4_ * auVar139._0_4_;
    auVar26._8_4_ = auVar139._8_4_ * auVar139._8_4_;
    auVar26._12_4_ = auVar139._12_4_ * auVar139._12_4_;
    auVar26._16_4_ = auVar139._16_4_ * auVar139._16_4_;
    auVar26._20_4_ = auVar139._20_4_ * auVar139._20_4_;
    auVar26._24_4_ = auVar139._24_4_ * auVar139._24_4_;
    auVar26._28_4_ = auVar139._28_4_;
    local_500._0_4_ = (undefined4)iVar15;
    local_500._4_12_ = auVar147._4_12_;
    auVar102 = vcmpps_avx(auVar26,auVar25,2);
    fVar159 = auVar171._0_4_ * 4.7683716e-07;
    local_500._16_16_ = auVar107._16_16_;
    auVar107._4_4_ = local_500._0_4_;
    auVar107._0_4_ = local_500._0_4_;
    auVar107._8_4_ = local_500._0_4_;
    auVar107._12_4_ = local_500._0_4_;
    auVar107._16_4_ = local_500._0_4_;
    auVar107._20_4_ = local_500._0_4_;
    auVar107._24_4_ = local_500._0_4_;
    auVar107._28_4_ = local_500._0_4_;
    auVar107 = vcmpps_avx(_DAT_01f7b060,auVar107,1);
    auVar162 = vpermilps_avx(auVar193,0xaa);
    uVar125 = auVar162._0_8_;
    auVar210._8_8_ = uVar125;
    auVar210._0_8_ = uVar125;
    auVar210._16_8_ = uVar125;
    auVar210._24_8_ = uVar125;
    auVar7 = vpermilps_avx(auVar214,0xaa);
    uVar125 = auVar7._0_8_;
    local_740._8_8_ = uVar125;
    local_740._0_8_ = uVar125;
    local_740._16_8_ = uVar125;
    local_740._24_8_ = uVar125;
    auVar171 = vpermilps_avx(auVar100,0xaa);
    uVar125 = auVar171._0_8_;
    auVar226._8_8_ = uVar125;
    auVar226._0_8_ = uVar125;
    auVar226._16_8_ = uVar125;
    auVar226._24_8_ = uVar125;
    auVar171 = vshufps_avx(auVar147,auVar147,0xaa);
    uVar125 = auVar171._0_8_;
    register0x00001508 = uVar125;
    local_720 = uVar125;
    register0x00001510 = uVar125;
    register0x00001518 = uVar125;
    auVar220 = ZEXT3264(_local_720);
    auVar139 = auVar107 & auVar102;
    uVar91 = *(uint *)(ray + k * 4 + 0x30);
    local_6e0._0_16_ = ZEXT416(uVar91);
    local_460._0_16_ = ZEXT416(uVar89);
    local_480._0_16_ = ZEXT416(uVar14);
    local_800 = auVar9._0_8_;
    uStack_7f8 = auVar9._8_8_;
    local_810 = auVar10._0_8_;
    uStack_808 = auVar10._8_8_;
    local_820 = auVar11._0_8_;
    uStack_818 = auVar11._8_8_;
    local_830._0_4_ = auVar12._0_4_;
    fVar19 = (float)local_830;
    local_830._4_4_ = auVar12._4_4_;
    fVar82 = local_830._4_4_;
    uStack_828._0_4_ = auVar12._8_4_;
    fVar83 = (float)uStack_828;
    uStack_828._4_4_ = auVar12._12_4_;
    fVar84 = uStack_828._4_4_;
    local_830 = auVar12._0_8_;
    uStack_828 = auVar12._8_8_;
    uVar125 = uVar99;
    uVar222 = uVar99;
    uVar223 = uVar99;
    fStack_63c = local_640;
    fStack_638 = local_640;
    fStack_634 = local_640;
    fStack_630 = local_640;
    fStack_62c = local_640;
    fStack_628 = local_640;
    fStack_624 = local_640;
    uStack_618 = local_620;
    uStack_610 = local_620;
    uStack_608 = local_620;
    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar139 >> 0x7f,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar139 >> 0xbf,0) == '\0') &&
        (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar139[0x1f])
    {
      auVar145 = ZEXT3264(local_6a0);
      auVar167 = ZEXT3264(local_5a0);
      auVar199 = ZEXT3264(local_760);
      auVar207 = ZEXT3264(local_660);
    }
    else {
      _local_320 = vandps_avx(auVar102,auVar107);
      local_4e0._0_4_ = auVar87._0_4_;
      local_4e0._4_4_ = auVar87._4_4_;
      fStack_4d8 = auVar87._8_4_;
      fStack_4d4 = auVar87._12_4_;
      fStack_4d0 = auVar87._16_4_;
      fStack_4cc = auVar87._20_4_;
      fStack_4c8 = auVar87._24_4_;
      fVar202 = auVar171._0_4_;
      fVar211 = auVar171._4_4_;
      auVar27._4_4_ = fVar211 * (float)local_4e0._4_4_;
      auVar27._0_4_ = fVar202 * (float)local_4e0._0_4_;
      auVar27._8_4_ = fVar202 * fStack_4d8;
      auVar27._12_4_ = fVar211 * fStack_4d4;
      auVar27._16_4_ = fVar202 * fStack_4d0;
      auVar27._20_4_ = fVar211 * fStack_4cc;
      auVar27._24_4_ = fVar202 * fStack_4c8;
      auVar27._28_4_ = local_320._28_4_;
      auVar171 = vfmadd213ps_fma(auVar111,auVar226,auVar27);
      auVar171 = vfmadd213ps_fma(auVar136,local_740,ZEXT1632(auVar171));
      auVar171 = vfmadd213ps_fma(auVar114,auVar210,ZEXT1632(auVar171));
      _local_4e0 = ZEXT1632(auVar171);
      local_4c0._0_4_ = auVar86._0_4_;
      local_4c0._4_4_ = auVar86._4_4_;
      fStack_4b8 = auVar86._8_4_;
      fStack_4b4 = auVar86._12_4_;
      fStack_4b0 = auVar86._16_4_;
      fStack_4ac = auVar86._20_4_;
      fStack_4a8 = auVar86._24_4_;
      auVar28._4_4_ = fVar211 * (float)local_4c0._4_4_;
      auVar28._0_4_ = fVar202 * (float)local_4c0._0_4_;
      auVar28._8_4_ = fVar202 * fStack_4b8;
      auVar28._12_4_ = fVar211 * fStack_4b4;
      auVar28._16_4_ = fVar202 * fStack_4b0;
      auVar28._20_4_ = fVar211 * fStack_4ac;
      auVar28._24_4_ = fVar202 * fStack_4a8;
      auVar28._28_4_ = local_320._28_4_;
      auVar171 = vfmadd213ps_fma(auVar164,auVar226,auVar28);
      auVar171 = vfmadd213ps_fma(auVar115,local_740,ZEXT1632(auVar171));
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 + 0x1210);
      auVar164 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 + 0x1694);
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar98 + 0x1b18);
      fVar120 = *(float *)(bspline_basis0 + lVar98 + 0x1f9c);
      fVar121 = *(float *)(bspline_basis0 + lVar98 + 0x1fa0);
      fVar122 = *(float *)(bspline_basis0 + lVar98 + 0x1fa4);
      fVar123 = *(float *)(bspline_basis0 + lVar98 + 0x1fa8);
      fVar124 = *(float *)(bspline_basis0 + lVar98 + 0x1fac);
      fVar200 = *(float *)(bspline_basis0 + lVar98 + 0x1fb0);
      fVar201 = *(float *)(bspline_basis0 + lVar98 + 0x1fb4);
      auVar184._0_4_ = fVar120 * local_640;
      auVar184._4_4_ = fVar121 * local_640;
      auVar184._8_4_ = fVar122 * local_640;
      auVar184._12_4_ = fVar123 * local_640;
      auVar184._16_4_ = fVar124 * local_640;
      auVar184._20_4_ = fVar200 * local_640;
      auVar184._24_4_ = fVar201 * local_640;
      auVar184._28_4_ = 0;
      auVar197._0_4_ = fVar146 * fVar120;
      auVar197._4_4_ = fVar119 * fVar121;
      auVar197._8_4_ = fVar146 * fVar122;
      auVar197._12_4_ = fVar119 * fVar123;
      auVar197._16_4_ = fVar146 * fVar124;
      auVar197._20_4_ = fVar119 * fVar200;
      auVar197._24_4_ = fVar146 * fVar201;
      auVar197._28_4_ = 0;
      auVar29._4_4_ = fVar121 * fVar211;
      auVar29._0_4_ = fVar120 * fVar202;
      auVar29._8_4_ = fVar122 * fVar202;
      auVar29._12_4_ = fVar123 * fVar211;
      auVar29._16_4_ = fVar124 * fVar202;
      auVar29._20_4_ = fVar200 * fVar211;
      auVar29._24_4_ = fVar201 * fVar202;
      auVar29._28_4_ = auVar162._4_4_;
      auVar12 = vfmadd231ps_fma(auVar184,auVar115,local_5a0);
      auVar193 = vfmadd231ps_fma(auVar197,auVar115,local_760);
      auVar214 = vfmadd231ps_fma(auVar29,auVar226,auVar115);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar164,local_660);
      auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar164,local_4a0);
      auVar214 = vfmadd231ps_fma(ZEXT1632(auVar214),local_740,auVar164);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar107,auVar225);
      auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar107,local_440);
      auVar214 = vfmadd231ps_fma(ZEXT1632(auVar214),auVar107,auVar210);
      fVar120 = *(float *)(bspline_basis1 + lVar98 + 0x1f9c);
      fVar121 = *(float *)(bspline_basis1 + lVar98 + 0x1fa0);
      fVar122 = *(float *)(bspline_basis1 + lVar98 + 0x1fa4);
      fVar123 = *(float *)(bspline_basis1 + lVar98 + 0x1fa8);
      fVar124 = *(float *)(bspline_basis1 + lVar98 + 0x1fac);
      fVar200 = *(float *)(bspline_basis1 + lVar98 + 0x1fb0);
      fVar201 = *(float *)(bspline_basis1 + lVar98 + 0x1fb4);
      auVar30._4_4_ = local_640 * fVar121;
      auVar30._0_4_ = local_640 * fVar120;
      auVar30._8_4_ = local_640 * fVar122;
      auVar30._12_4_ = local_640 * fVar123;
      auVar30._16_4_ = local_640 * fVar124;
      auVar30._20_4_ = local_640 * fVar200;
      auVar30._24_4_ = local_640 * fVar201;
      auVar30._28_4_ = local_640;
      auVar31._4_4_ = fVar119 * fVar121;
      auVar31._0_4_ = fVar146 * fVar120;
      auVar31._8_4_ = fVar146 * fVar122;
      auVar31._12_4_ = fVar119 * fVar123;
      auVar31._16_4_ = fVar146 * fVar124;
      auVar31._20_4_ = fVar119 * fVar200;
      auVar31._24_4_ = fVar146 * fVar201;
      auVar31._28_4_ = fVar119;
      auVar32._4_4_ = fVar121 * fVar211;
      auVar32._0_4_ = fVar120 * fVar202;
      auVar32._8_4_ = fVar122 * fVar202;
      auVar32._12_4_ = fVar123 * fVar211;
      auVar32._16_4_ = fVar124 * fVar202;
      auVar32._20_4_ = fVar200 * fVar211;
      auVar32._24_4_ = fVar201 * fVar202;
      auVar32._28_4_ = auVar7._4_4_;
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 + 0x1b18);
      auVar7 = vfmadd231ps_fma(auVar30,auVar107,local_5a0);
      auVar100 = vfmadd231ps_fma(auVar31,auVar107,local_760);
      auVar147 = vfmadd231ps_fma(auVar32,auVar226,auVar107);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 + 0x1694);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar107,local_660);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar107,local_4a0);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar107,local_740);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar98 + 0x1210);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar107,auVar225);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar107,local_440);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar210,auVar107);
      auVar107 = vandps_avx(local_160,ZEXT1632(auVar12));
      auVar164 = vandps_avx(ZEXT1632(auVar193),local_160);
      auVar164 = vmaxps_avx(auVar107,auVar164);
      auVar107 = vandps_avx(ZEXT1632(auVar214),local_160);
      auVar107 = vmaxps_avx(auVar164,auVar107);
      auVar133._4_4_ = fVar159;
      auVar133._0_4_ = fVar159;
      auVar133._8_4_ = fVar159;
      auVar133._12_4_ = fVar159;
      auVar133._16_4_ = fVar159;
      auVar133._20_4_ = fVar159;
      auVar133._24_4_ = fVar159;
      auVar133._28_4_ = fVar159;
      auVar107 = vcmpps_avx(auVar107,auVar133,1);
      auVar115 = vblendvps_avx(ZEXT1632(auVar12),auVar103,auVar107);
      auVar111 = vblendvps_avx(ZEXT1632(auVar193),_local_300,auVar107);
      auVar107 = vandps_avx(local_160,ZEXT1632(auVar7));
      auVar164 = vandps_avx(ZEXT1632(auVar100),local_160);
      auVar164 = vmaxps_avx(auVar107,auVar164);
      auVar107 = vandps_avx(ZEXT1632(auVar147),local_160);
      auVar107 = vmaxps_avx(auVar164,auVar107);
      auVar164 = vcmpps_avx(auVar107,auVar133,1);
      auVar107 = vblendvps_avx(ZEXT1632(auVar7),auVar103,auVar164);
      auVar164 = vblendvps_avx(ZEXT1632(auVar100),_local_300,auVar164);
      auVar171 = vfmadd213ps_fma(auVar157,auVar210,ZEXT1632(auVar171));
      auVar7 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar111,auVar111);
      auVar157 = vrsqrtps_avx(ZEXT1632(auVar7));
      fVar146 = auVar157._0_4_;
      fVar119 = auVar157._4_4_;
      fVar120 = auVar157._8_4_;
      fVar121 = auVar157._12_4_;
      fVar122 = auVar157._16_4_;
      fVar123 = auVar157._20_4_;
      fVar124 = auVar157._24_4_;
      auVar33._4_4_ = fVar119 * fVar119 * fVar119 * auVar7._4_4_ * -0.5;
      auVar33._0_4_ = fVar146 * fVar146 * fVar146 * auVar7._0_4_ * -0.5;
      auVar33._8_4_ = fVar120 * fVar120 * fVar120 * auVar7._8_4_ * -0.5;
      auVar33._12_4_ = fVar121 * fVar121 * fVar121 * auVar7._12_4_ * -0.5;
      auVar33._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
      auVar33._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar33._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar33._28_4_ = 0;
      auVar227._8_4_ = 0x3fc00000;
      auVar227._0_8_ = 0x3fc000003fc00000;
      auVar227._12_4_ = 0x3fc00000;
      auVar227._16_4_ = 0x3fc00000;
      auVar227._20_4_ = 0x3fc00000;
      auVar227._24_4_ = 0x3fc00000;
      auVar227._28_4_ = 0x3fc00000;
      auVar7 = vfmadd231ps_fma(auVar33,auVar227,auVar157);
      fVar146 = auVar7._0_4_;
      fVar119 = auVar7._4_4_;
      auVar34._4_4_ = auVar111._4_4_ * fVar119;
      auVar34._0_4_ = auVar111._0_4_ * fVar146;
      fVar120 = auVar7._8_4_;
      auVar34._8_4_ = auVar111._8_4_ * fVar120;
      fVar121 = auVar7._12_4_;
      auVar34._12_4_ = auVar111._12_4_ * fVar121;
      auVar34._16_4_ = auVar111._16_4_ * 0.0;
      auVar34._20_4_ = auVar111._20_4_ * 0.0;
      auVar34._24_4_ = auVar111._24_4_ * 0.0;
      auVar34._28_4_ = auVar157._28_4_;
      auVar35._4_4_ = -auVar115._4_4_ * fVar119;
      auVar35._0_4_ = -auVar115._0_4_ * fVar146;
      auVar35._8_4_ = -auVar115._8_4_ * fVar120;
      auVar35._12_4_ = -auVar115._12_4_ * fVar121;
      auVar35._16_4_ = -auVar115._16_4_ * 0.0;
      auVar35._20_4_ = -auVar115._20_4_ * 0.0;
      auVar35._24_4_ = -auVar115._24_4_ * 0.0;
      auVar35._28_4_ = auVar103._28_4_;
      auVar7 = vfmadd213ps_fma(auVar107,auVar107,ZEXT832(0) << 0x20);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar164,auVar164);
      auVar115 = vrsqrtps_avx(ZEXT1632(auVar7));
      auVar36._28_4_ = auVar162._4_4_;
      auVar36._0_28_ =
           ZEXT1628(CONCAT412(fVar121 * 0.0,
                              CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar146 * 0.0))));
      fVar146 = auVar115._0_4_;
      fVar119 = auVar115._4_4_;
      fVar120 = auVar115._8_4_;
      fVar121 = auVar115._12_4_;
      fVar122 = auVar115._16_4_;
      fVar123 = auVar115._20_4_;
      fVar124 = auVar115._24_4_;
      auVar37._4_4_ = fVar119 * fVar119 * fVar119 * auVar7._4_4_ * -0.5;
      auVar37._0_4_ = fVar146 * fVar146 * fVar146 * auVar7._0_4_ * -0.5;
      auVar37._8_4_ = fVar120 * fVar120 * fVar120 * auVar7._8_4_ * -0.5;
      auVar37._12_4_ = fVar121 * fVar121 * fVar121 * auVar7._12_4_ * -0.5;
      auVar37._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
      auVar37._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
      auVar37._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar37._28_4_ = 0xbf000000;
      auVar162 = vfmadd231ps_fma(auVar37,auVar227,auVar115);
      fVar146 = auVar162._0_4_;
      fVar119 = auVar162._4_4_;
      auVar38._4_4_ = fVar119 * auVar164._4_4_;
      auVar38._0_4_ = fVar146 * auVar164._0_4_;
      fVar120 = auVar162._8_4_;
      auVar38._8_4_ = fVar120 * auVar164._8_4_;
      fVar121 = auVar162._12_4_;
      auVar38._12_4_ = fVar121 * auVar164._12_4_;
      auVar38._16_4_ = auVar164._16_4_ * 0.0;
      auVar38._20_4_ = auVar164._20_4_ * 0.0;
      auVar38._24_4_ = auVar164._24_4_ * 0.0;
      auVar38._28_4_ = 0x3fc00000;
      auVar39._4_4_ = fVar119 * -auVar107._4_4_;
      auVar39._0_4_ = fVar146 * -auVar107._0_4_;
      auVar39._8_4_ = fVar120 * -auVar107._8_4_;
      auVar39._12_4_ = fVar121 * -auVar107._12_4_;
      auVar39._16_4_ = -auVar107._16_4_ * 0.0;
      auVar39._20_4_ = -auVar107._20_4_ * 0.0;
      auVar39._24_4_ = -auVar107._24_4_ * 0.0;
      auVar39._28_4_ = auVar174._4_4_;
      auVar107 = ZEXT1632(CONCAT412(fVar121 * 0.0,
                                    CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar146 * 0.0))));
      auVar174 = vfmadd213ps_fma(auVar34,ZEXT1632(auVar8),auVar131);
      auVar164 = ZEXT1632(auVar8);
      auVar162 = vfmadd213ps_fma(auVar35,auVar164,auVar105);
      auVar7 = vfmadd213ps_fma(auVar36,auVar164,ZEXT1632(auVar171));
      auVar100 = vfnmadd213ps_fma(auVar34,auVar164,auVar131);
      auVar12 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar101),auVar128);
      auVar147 = vfnmadd213ps_fma(auVar35,auVar164,auVar105);
      auVar164 = ZEXT1632(auVar101);
      auVar193 = vfmadd213ps_fma(auVar39,auVar164,local_2e0);
      auVar180 = ZEXT1632(auVar8);
      auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar171),auVar180,auVar36);
      auVar8 = vfmadd213ps_fma(auVar107,auVar164,_local_4e0);
      auVar160 = vfnmadd213ps_fma(auVar38,auVar164,auVar128);
      auVar161 = vfnmadd213ps_fma(auVar39,auVar164,local_2e0);
      auVar188 = vfnmadd231ps_fma(_local_4e0,ZEXT1632(auVar101),auVar107);
      auVar107 = vsubps_avx(ZEXT1632(auVar193),ZEXT1632(auVar147));
      auVar164 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar168));
      auVar40._4_4_ = auVar168._4_4_ * auVar107._4_4_;
      auVar40._0_4_ = auVar168._0_4_ * auVar107._0_4_;
      auVar40._8_4_ = auVar168._8_4_ * auVar107._8_4_;
      auVar40._12_4_ = auVar168._12_4_ * auVar107._12_4_;
      auVar40._16_4_ = auVar107._16_4_ * 0.0;
      auVar40._20_4_ = auVar107._20_4_ * 0.0;
      auVar40._24_4_ = auVar107._24_4_ * 0.0;
      auVar40._28_4_ = 0;
      auVar214 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar147),auVar164);
      auVar41._4_4_ = auVar100._4_4_ * auVar164._4_4_;
      auVar41._0_4_ = auVar100._0_4_ * auVar164._0_4_;
      auVar41._8_4_ = auVar100._8_4_ * auVar164._8_4_;
      auVar41._12_4_ = auVar100._12_4_ * auVar164._12_4_;
      auVar41._16_4_ = auVar164._16_4_ * 0.0;
      auVar41._20_4_ = auVar164._20_4_ * 0.0;
      auVar41._24_4_ = auVar164._24_4_ * 0.0;
      auVar41._28_4_ = auVar164._28_4_;
      auVar114 = ZEXT1632(auVar100);
      auVar164 = vsubps_avx(ZEXT1632(auVar12),auVar114);
      auVar171 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar168),auVar164);
      auVar42._4_4_ = auVar147._4_4_ * auVar164._4_4_;
      auVar42._0_4_ = auVar147._0_4_ * auVar164._0_4_;
      auVar42._8_4_ = auVar147._8_4_ * auVar164._8_4_;
      auVar42._12_4_ = auVar147._12_4_ * auVar164._12_4_;
      auVar42._16_4_ = auVar164._16_4_ * 0.0;
      auVar42._20_4_ = auVar164._20_4_ * 0.0;
      auVar42._24_4_ = auVar164._24_4_ * 0.0;
      auVar42._28_4_ = auVar164._28_4_;
      auVar100 = vfmsub231ps_fma(auVar42,auVar114,auVar107);
      auVar107 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar171 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar107,ZEXT1632(auVar171));
      auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar107,ZEXT1632(auVar214));
      auVar105 = vcmpps_avx(ZEXT1632(auVar171),ZEXT1232(ZEXT412(0)) << 0x20,2);
      auVar107 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar174),auVar105);
      auVar164 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar162),auVar105);
      auVar115 = vblendvps_avx(ZEXT1632(auVar188),ZEXT1632(auVar7),auVar105);
      auVar157 = vblendvps_avx(auVar114,ZEXT1632(auVar12),auVar105);
      auVar111 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar193),auVar105);
      auVar136 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar8),auVar105);
      auVar114 = vblendvps_avx(ZEXT1632(auVar12),auVar114,auVar105);
      auVar102 = vblendvps_avx(ZEXT1632(auVar193),ZEXT1632(auVar147),auVar105);
      auVar171 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      auVar139 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar168),auVar105);
      auVar131 = vsubps_avx(auVar114,auVar107);
      auVar102 = vsubps_avx(auVar102,auVar164);
      auVar128 = vsubps_avx(auVar139,auVar115);
      auVar129 = vsubps_avx(auVar107,auVar157);
      auVar163 = vsubps_avx(auVar164,auVar111);
      auVar179 = vsubps_avx(auVar115,auVar136);
      auVar43._4_4_ = auVar128._4_4_ * auVar107._4_4_;
      auVar43._0_4_ = auVar128._0_4_ * auVar107._0_4_;
      auVar43._8_4_ = auVar128._8_4_ * auVar107._8_4_;
      auVar43._12_4_ = auVar128._12_4_ * auVar107._12_4_;
      auVar43._16_4_ = auVar128._16_4_ * auVar107._16_4_;
      auVar43._20_4_ = auVar128._20_4_ * auVar107._20_4_;
      auVar43._24_4_ = auVar128._24_4_ * auVar107._24_4_;
      auVar43._28_4_ = auVar139._28_4_;
      auVar174 = vfmsub231ps_fma(auVar43,auVar115,auVar131);
      auVar44._4_4_ = auVar131._4_4_ * auVar164._4_4_;
      auVar44._0_4_ = auVar131._0_4_ * auVar164._0_4_;
      auVar44._8_4_ = auVar131._8_4_ * auVar164._8_4_;
      auVar44._12_4_ = auVar131._12_4_ * auVar164._12_4_;
      auVar44._16_4_ = auVar131._16_4_ * auVar164._16_4_;
      auVar44._20_4_ = auVar131._20_4_ * auVar164._20_4_;
      auVar44._24_4_ = auVar131._24_4_ * auVar164._24_4_;
      auVar44._28_4_ = auVar114._28_4_;
      auVar162 = vfmsub231ps_fma(auVar44,auVar107,auVar102);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar162),ZEXT832(0) << 0x20,ZEXT1632(auVar174));
      auVar108._0_4_ = auVar102._0_4_ * auVar115._0_4_;
      auVar108._4_4_ = auVar102._4_4_ * auVar115._4_4_;
      auVar108._8_4_ = auVar102._8_4_ * auVar115._8_4_;
      auVar108._12_4_ = auVar102._12_4_ * auVar115._12_4_;
      auVar108._16_4_ = auVar102._16_4_ * auVar115._16_4_;
      auVar108._20_4_ = auVar102._20_4_ * auVar115._20_4_;
      auVar108._24_4_ = auVar102._24_4_ * auVar115._24_4_;
      auVar108._28_4_ = 0;
      auVar162 = vfmsub231ps_fma(auVar108,auVar164,auVar128);
      auVar162 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT832(0) << 0x20,ZEXT1632(auVar162));
      auVar109._0_4_ = auVar179._0_4_ * auVar157._0_4_;
      auVar109._4_4_ = auVar179._4_4_ * auVar157._4_4_;
      auVar109._8_4_ = auVar179._8_4_ * auVar157._8_4_;
      auVar109._12_4_ = auVar179._12_4_ * auVar157._12_4_;
      auVar109._16_4_ = auVar179._16_4_ * auVar157._16_4_;
      auVar109._20_4_ = auVar179._20_4_ * auVar157._20_4_;
      auVar109._24_4_ = auVar179._24_4_ * auVar157._24_4_;
      auVar109._28_4_ = 0;
      auVar174 = vfmsub231ps_fma(auVar109,auVar129,auVar136);
      auVar45._4_4_ = auVar163._4_4_ * auVar136._4_4_;
      auVar45._0_4_ = auVar163._0_4_ * auVar136._0_4_;
      auVar45._8_4_ = auVar163._8_4_ * auVar136._8_4_;
      auVar45._12_4_ = auVar163._12_4_ * auVar136._12_4_;
      auVar45._16_4_ = auVar163._16_4_ * auVar136._16_4_;
      auVar45._20_4_ = auVar163._20_4_ * auVar136._20_4_;
      auVar45._24_4_ = auVar163._24_4_ * auVar136._24_4_;
      auVar45._28_4_ = auVar136._28_4_;
      auVar7 = vfmsub231ps_fma(auVar45,auVar111,auVar179);
      auVar46._4_4_ = auVar129._4_4_ * auVar111._4_4_;
      auVar46._0_4_ = auVar129._0_4_ * auVar111._0_4_;
      auVar46._8_4_ = auVar129._8_4_ * auVar111._8_4_;
      auVar46._12_4_ = auVar129._12_4_ * auVar111._12_4_;
      auVar46._16_4_ = auVar129._16_4_ * auVar111._16_4_;
      auVar46._20_4_ = auVar129._20_4_ * auVar111._20_4_;
      auVar46._24_4_ = auVar129._24_4_ * auVar111._24_4_;
      auVar46._28_4_ = auVar111._28_4_;
      auVar8 = vfmsub231ps_fma(auVar46,auVar163,auVar157);
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar174));
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar157 = vmaxps_avx(ZEXT1632(auVar162),ZEXT1632(auVar7));
      auVar157 = vcmpps_avx(auVar157,ZEXT832(0) << 0x20,2);
      auVar174 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
      auVar171 = vpand_avx(auVar174,auVar171);
      auVar157 = vpmovsxwd_avx2(auVar171);
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar157 >> 0x7f,0) == '\0') &&
            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar157 >> 0xbf,0) == '\0') &&
          (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar157[0x1f]) {
LAB_014092c0:
        auVar182._8_8_ = uStack_538;
        auVar182._0_8_ = local_540;
        auVar182._16_8_ = uStack_530;
        auVar182._24_8_ = uStack_528;
      }
      else {
        auVar47._4_4_ = auVar102._4_4_ * auVar179._4_4_;
        auVar47._0_4_ = auVar102._0_4_ * auVar179._0_4_;
        auVar47._8_4_ = auVar102._8_4_ * auVar179._8_4_;
        auVar47._12_4_ = auVar102._12_4_ * auVar179._12_4_;
        auVar47._16_4_ = auVar102._16_4_ * auVar179._16_4_;
        auVar47._20_4_ = auVar102._20_4_ * auVar179._20_4_;
        auVar47._24_4_ = auVar102._24_4_ * auVar179._24_4_;
        auVar47._28_4_ = auVar157._28_4_;
        auVar193 = vfmsub231ps_fma(auVar47,auVar163,auVar128);
        auVar134._0_4_ = auVar128._0_4_ * auVar129._0_4_;
        auVar134._4_4_ = auVar128._4_4_ * auVar129._4_4_;
        auVar134._8_4_ = auVar128._8_4_ * auVar129._8_4_;
        auVar134._12_4_ = auVar128._12_4_ * auVar129._12_4_;
        auVar134._16_4_ = auVar128._16_4_ * auVar129._16_4_;
        auVar134._20_4_ = auVar128._20_4_ * auVar129._20_4_;
        auVar134._24_4_ = auVar128._24_4_ * auVar129._24_4_;
        auVar134._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar134,auVar131,auVar179);
        auVar48._4_4_ = auVar131._4_4_ * auVar163._4_4_;
        auVar48._0_4_ = auVar131._0_4_ * auVar163._0_4_;
        auVar48._8_4_ = auVar131._8_4_ * auVar163._8_4_;
        auVar48._12_4_ = auVar131._12_4_ * auVar163._12_4_;
        auVar48._16_4_ = auVar131._16_4_ * auVar163._16_4_;
        auVar48._20_4_ = auVar131._20_4_ * auVar163._20_4_;
        auVar48._24_4_ = auVar131._24_4_ * auVar163._24_4_;
        auVar48._28_4_ = auVar131._28_4_;
        auVar214 = vfmsub231ps_fma(auVar48,auVar129,auVar102);
        auVar174 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar214));
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT1632(auVar193),_DAT_01f7b000);
        auVar157 = vrcpps_avx(ZEXT1632(auVar8));
        auVar216._8_4_ = 0x3f800000;
        auVar216._0_8_ = 0x3f8000003f800000;
        auVar216._12_4_ = 0x3f800000;
        auVar216._16_4_ = 0x3f800000;
        auVar216._20_4_ = 0x3f800000;
        auVar216._24_4_ = 0x3f800000;
        auVar216._28_4_ = 0x3f800000;
        auVar174 = vfnmadd213ps_fma(auVar157,ZEXT1632(auVar8),auVar216);
        auVar174 = vfmadd132ps_fma(ZEXT1632(auVar174),auVar157,auVar157);
        auVar49._4_4_ = auVar214._4_4_ * auVar115._4_4_;
        auVar49._0_4_ = auVar214._0_4_ * auVar115._0_4_;
        auVar49._8_4_ = auVar214._8_4_ * auVar115._8_4_;
        auVar49._12_4_ = auVar214._12_4_ * auVar115._12_4_;
        auVar49._16_4_ = auVar115._16_4_ * 0.0;
        auVar49._20_4_ = auVar115._20_4_ * 0.0;
        auVar49._24_4_ = auVar115._24_4_ * 0.0;
        auVar49._28_4_ = auVar115._28_4_;
        auVar12 = vfmadd231ps_fma(auVar49,ZEXT1632(auVar12),auVar164);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar193),auVar107);
        fVar146 = auVar174._0_4_;
        fVar119 = auVar174._4_4_;
        fVar120 = auVar174._8_4_;
        fVar121 = auVar174._12_4_;
        auVar157 = ZEXT1632(CONCAT412(fVar121 * auVar12._12_4_,
                                      CONCAT48(fVar120 * auVar12._8_4_,
                                               CONCAT44(fVar119 * auVar12._4_4_,
                                                        fVar146 * auVar12._0_4_))));
        auVar110._4_4_ = uVar91;
        auVar110._0_4_ = uVar91;
        auVar110._8_4_ = uVar91;
        auVar110._12_4_ = uVar91;
        auVar110._16_4_ = uVar91;
        auVar110._20_4_ = uVar91;
        auVar110._24_4_ = uVar91;
        auVar110._28_4_ = uVar91;
        uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar135._4_4_ = uVar97;
        auVar135._0_4_ = uVar97;
        auVar135._8_4_ = uVar97;
        auVar135._12_4_ = uVar97;
        auVar135._16_4_ = uVar97;
        auVar135._20_4_ = uVar97;
        auVar135._24_4_ = uVar97;
        auVar135._28_4_ = uVar97;
        auVar107 = vcmpps_avx(auVar110,auVar157,2);
        auVar115 = vcmpps_avx(auVar157,auVar135,2);
        auVar107 = vandps_avx(auVar115,auVar107);
        auVar174 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar171 = vpand_avx(auVar171,auVar174);
        auVar107 = vpmovsxwd_avx2(auVar171);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0x7f,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0xbf,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar107[0x1f]) goto LAB_014092c0;
        auVar107 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,4);
        auVar174 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar171 = vpand_avx(auVar171,auVar174);
        auVar107 = vpmovsxwd_avx2(auVar171);
        auVar182._8_8_ = uStack_538;
        auVar182._0_8_ = local_540;
        auVar182._16_8_ = uStack_530;
        auVar182._24_8_ = uStack_528;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          auVar111 = ZEXT1632(CONCAT412(fVar121 * auVar162._12_4_,
                                        CONCAT48(fVar120 * auVar162._8_4_,
                                                 CONCAT44(fVar119 * auVar162._4_4_,
                                                          fVar146 * auVar162._0_4_))));
          auVar136 = ZEXT1632(CONCAT412(fVar121 * auVar7._12_4_,
                                        CONCAT48(fVar120 * auVar7._8_4_,
                                                 CONCAT44(fVar119 * auVar7._4_4_,
                                                          fVar146 * auVar7._0_4_))));
          auVar181._8_4_ = 0x3f800000;
          auVar181._0_8_ = 0x3f8000003f800000;
          auVar181._12_4_ = 0x3f800000;
          auVar181._16_4_ = 0x3f800000;
          auVar181._20_4_ = 0x3f800000;
          auVar181._24_4_ = 0x3f800000;
          auVar181._28_4_ = 0x3f800000;
          auVar115 = vsubps_avx(auVar181,auVar111);
          _local_140 = vblendvps_avx(auVar115,auVar111,auVar105);
          auVar115 = vsubps_avx(auVar181,auVar136);
          local_340 = vblendvps_avx(auVar115,auVar136,auVar105);
          auVar182 = auVar107;
          local_520 = auVar157;
        }
      }
      auVar167 = ZEXT3264(auVar226);
      auVar220 = ZEXT3264(_local_720);
      auVar145 = ZEXT3264(auVar210);
      auVar207 = ZEXT3264(local_660);
      if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar182 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar182 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar182 >> 0x7f,0) == '\0') &&
            (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar182 >> 0xbf,0) == '\0') &&
          (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar182[0x1f]) {
        auVar145 = ZEXT3264(local_6a0);
        auVar167 = ZEXT3264(local_5a0);
        auVar199 = ZEXT3264(local_760);
      }
      else {
        auVar107 = vsubps_avx(ZEXT1632(auVar101),auVar180);
        auVar171 = vfmadd213ps_fma(auVar107,_local_140,auVar180);
        fVar146 = *(float *)((long)local_6e8->ray_space + k * 4 + -0x10);
        auVar50._4_4_ = (auVar171._4_4_ + auVar171._4_4_) * fVar146;
        auVar50._0_4_ = (auVar171._0_4_ + auVar171._0_4_) * fVar146;
        auVar50._8_4_ = (auVar171._8_4_ + auVar171._8_4_) * fVar146;
        auVar50._12_4_ = (auVar171._12_4_ + auVar171._12_4_) * fVar146;
        auVar50._16_4_ = fVar146 * 0.0;
        auVar50._20_4_ = fVar146 * 0.0;
        auVar50._24_4_ = fVar146 * 0.0;
        auVar50._28_4_ = 0;
        auVar107 = vcmpps_avx(local_520,auVar50,6);
        auVar115 = auVar182 & auVar107;
        auVar199 = ZEXT3264(local_760);
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) {
          auVar145 = ZEXT3264(local_6a0);
          auVar167 = ZEXT3264(local_5a0);
        }
        else {
          auVar137._8_4_ = 0xbf800000;
          auVar137._0_8_ = 0xbf800000bf800000;
          auVar137._12_4_ = 0xbf800000;
          auVar137._16_4_ = 0xbf800000;
          auVar137._20_4_ = 0xbf800000;
          auVar137._24_4_ = 0xbf800000;
          auVar137._28_4_ = 0xbf800000;
          auVar156._8_4_ = 0x40000000;
          auVar156._0_8_ = 0x4000000040000000;
          auVar156._12_4_ = 0x40000000;
          auVar156._16_4_ = 0x40000000;
          auVar156._20_4_ = 0x40000000;
          auVar156._24_4_ = 0x40000000;
          auVar156._28_4_ = 0x40000000;
          auVar171 = vfmadd213ps_fma(local_340,auVar156,auVar137);
          local_2a0 = _local_140;
          local_340 = ZEXT1632(auVar171);
          auVar115 = local_340;
          local_280 = ZEXT1632(auVar171);
          local_260 = local_520;
          local_240 = 0;
          local_23c = iVar15;
          local_230 = local_800;
          uStack_228 = uStack_7f8;
          local_220 = local_810;
          uStack_218 = uStack_808;
          local_210 = local_820;
          uStack_208 = uStack_818;
          local_200 = local_830;
          uStack_1f8 = uStack_828;
          local_340 = auVar115;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_580 = vandps_avx(auVar107,auVar182);
            fVar146 = 1.0 / (float)local_500._0_4_;
            local_1c0[0] = fVar146 * ((float)local_140._0_4_ + 0.0);
            local_1c0[1] = fVar146 * ((float)local_140._4_4_ + 1.0);
            local_1c0[2] = fVar146 * (fStack_138 + 2.0);
            local_1c0[3] = fVar146 * (fStack_134 + 3.0);
            fStack_1b0 = fVar146 * (fStack_130 + 4.0);
            fStack_1ac = fVar146 * (fStack_12c + 5.0);
            fStack_1a8 = fVar146 * (fStack_128 + 6.0);
            fStack_1a4 = fStack_124 + 7.0;
            local_340._0_8_ = auVar171._0_8_;
            local_340._8_8_ = auVar171._8_8_;
            local_1a0 = local_340._0_8_;
            uStack_198 = local_340._8_8_;
            uStack_190 = 0;
            uStack_188 = 0;
            local_180 = local_520;
            auVar138._8_4_ = 0x7f800000;
            auVar138._0_8_ = 0x7f8000007f800000;
            auVar138._12_4_ = 0x7f800000;
            auVar138._16_4_ = 0x7f800000;
            auVar138._20_4_ = 0x7f800000;
            auVar138._24_4_ = 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar138,local_520,local_580);
            auVar115 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar115 = vminps_avx(auVar107,auVar115);
            auVar157 = vshufpd_avx(auVar115,auVar115,5);
            auVar115 = vminps_avx(auVar115,auVar157);
            auVar157 = vpermpd_avx2(auVar115,0x4e);
            auVar115 = vminps_avx(auVar115,auVar157);
            auVar115 = vcmpps_avx(auVar107,auVar115,0);
            auVar157 = local_580 & auVar115;
            auVar107 = local_580;
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar157 >> 0x7f,0) != '\0') ||
                  (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar157 >> 0xbf,0) != '\0') ||
                (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar157[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar115,local_580);
            }
            uVar88 = vmovmskps_avx(auVar107);
            uVar91 = 0;
            for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
              uVar91 = uVar91 + 1;
            }
            uVar93 = (ulong)uVar91;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar146 = local_1c0[uVar93];
              uVar97 = *(undefined4 *)((long)&local_1a0 + uVar93 * 4);
              fVar119 = 1.0 - fVar146;
              auVar171 = ZEXT416((uint)(fVar146 * fVar119 * 4.0));
              auVar174 = vfnmsub213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar171);
              auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),auVar171);
              fVar119 = fVar119 * -fVar119 * 0.5;
              fVar120 = auVar174._0_4_ * 0.5;
              fVar121 = auVar171._0_4_ * 0.5;
              fVar122 = fVar146 * fVar146 * 0.5;
              auVar169._0_4_ = fVar122 * fVar19;
              auVar169._4_4_ = fVar122 * fVar82;
              auVar169._8_4_ = fVar122 * fVar83;
              auVar169._12_4_ = fVar122 * fVar84;
              auVar148._4_4_ = fVar121;
              auVar148._0_4_ = fVar121;
              auVar148._8_4_ = fVar121;
              auVar148._12_4_ = fVar121;
              auVar171 = vfmadd132ps_fma(auVar148,auVar169,auVar11);
              auVar170._4_4_ = fVar120;
              auVar170._0_4_ = fVar120;
              auVar170._8_4_ = fVar120;
              auVar170._12_4_ = fVar120;
              auVar171 = vfmadd132ps_fma(auVar170,auVar171,auVar10);
              auVar149._4_4_ = fVar119;
              auVar149._0_4_ = fVar119;
              auVar149._8_4_ = fVar119;
              auVar149._12_4_ = fVar119;
              auVar171 = vfmadd132ps_fma(auVar149,auVar171,auVar9);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar93 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar171._0_4_;
              uVar4 = vextractps_avx(auVar171,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
              uVar4 = vextractps_avx(auVar171,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar4;
              *(float *)(ray + k * 4 + 0xf0) = fVar146;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar97;
              *(uint *)(ray + k * 4 + 0x110) = uVar14;
              *(uint *)(ray + k * 4 + 0x120) = uVar89;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_680._0_16_ = CONCAT412(uVar89,CONCAT48(uVar89,CONCAT44(uVar89,uVar89)));
              local_680 = ZEXT1632(local_680._0_16_);
              local_5c0._0_8_ = CONCAT44(uVar14,uVar14);
              local_5c0 = ZEXT1632(CONCAT412(uVar14,CONCAT48(uVar14,local_5c0._0_8_)));
              local_5e0 = ZEXT1632(*local_6f0);
              local_7a0._16_16_ = auVar164._16_16_;
              local_7a0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_7e0 = uVar94;
              local_780 = auVar210;
              local_6c0 = auVar226;
              local_600 = uVar99;
              uStack_5f8 = uVar99;
              uStack_5f0 = uVar99;
              uStack_5e8 = uVar99;
              _local_4c0 = auVar103;
              while( true ) {
                fVar146 = local_1c0[uVar93];
                local_3e0._4_4_ = fVar146;
                local_3e0._0_4_ = fVar146;
                local_3e0._8_4_ = fVar146;
                local_3e0._12_4_ = fVar146;
                local_3d0 = *(undefined4 *)((long)&local_1a0 + uVar93 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar93 * 4);
                fVar120 = 1.0 - fVar146;
                auVar171 = ZEXT416((uint)(fVar146 * fVar120 * 4.0));
                auVar174 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar171);
                auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),auVar171);
                fVar119 = auVar171._0_4_ * 0.5;
                fVar146 = fVar146 * fVar146 * 0.5;
                auVar177._0_4_ = fVar146 * fVar19;
                auVar177._4_4_ = fVar146 * fVar82;
                auVar177._8_4_ = fVar146 * fVar83;
                auVar177._12_4_ = fVar146 * fVar84;
                auVar154._4_4_ = fVar119;
                auVar154._0_4_ = fVar119;
                auVar154._8_4_ = fVar119;
                auVar154._12_4_ = fVar119;
                auVar171 = vfmadd132ps_fma(auVar154,auVar177,auVar11);
                fVar146 = auVar174._0_4_ * 0.5;
                auVar178._4_4_ = fVar146;
                auVar178._0_4_ = fVar146;
                auVar178._8_4_ = fVar146;
                auVar178._12_4_ = fVar146;
                auVar171 = vfmadd132ps_fma(auVar178,auVar171,auVar10);
                local_7d0.context = context->user;
                fVar146 = fVar120 * -fVar120 * 0.5;
                auVar155._4_4_ = fVar146;
                auVar155._0_4_ = fVar146;
                auVar155._8_4_ = fVar146;
                auVar155._12_4_ = fVar146;
                auVar174 = vfmadd132ps_fma(auVar155,auVar171,auVar9);
                local_410 = auVar174._0_4_;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                auVar171 = vshufps_avx(auVar174,auVar174,0x55);
                local_400 = auVar171;
                local_3f0 = vshufps_avx(auVar174,auVar174,0xaa);
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                local_3c0 = local_5c0._0_8_;
                uStack_3b8 = local_5c0._8_8_;
                local_3b0 = local_680._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_680._0_16_),ZEXT1632(local_680._0_16_));
                uStack_39c = (local_7d0.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_7d0.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_7f0 = local_5e0._0_16_;
                local_7d0.valid = (int *)local_7f0;
                local_7d0.geometryUserPtr = pGVar16->userPtr;
                local_7d0.hit = (RTCHitN *)&local_410;
                local_7d0.N = 4;
                local_7d0.ray = (RTCRayN *)ray;
                if (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar16->intersectionFilterN)(&local_7d0);
                  auVar220 = ZEXT3264(_local_720);
                  auVar167 = ZEXT3264(local_6c0);
                  auVar145 = ZEXT3264(local_780);
                  auVar207 = ZEXT3264(local_660);
                  auVar199 = ZEXT3264(local_760);
                  uVar94 = local_7e0;
                  uVar99 = local_600;
                  uVar125 = uStack_5f8;
                  uVar222 = uStack_5f0;
                  uVar223 = uStack_5e8;
                }
                if (local_7f0 == (undefined1  [16])0x0) {
                  auVar171 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar174 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar171 = auVar171 ^ auVar174;
                }
                else {
                  p_Var18 = context->args->filter;
                  auVar174 = vpcmpeqd_avx(auVar171,auVar171);
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var18)(&local_7d0);
                    auVar220 = ZEXT3264(_local_720);
                    auVar167 = ZEXT3264(local_6c0);
                    auVar145 = ZEXT3264(local_780);
                    auVar207 = ZEXT3264(local_660);
                    auVar199 = ZEXT3264(local_760);
                    auVar174 = vpcmpeqd_avx(auVar174,auVar174);
                    uVar99 = local_600;
                    uVar125 = uStack_5f8;
                    uVar222 = uStack_5f0;
                    uVar223 = uStack_5e8;
                  }
                  auVar162 = vpcmpeqd_avx(local_7f0,_DAT_01f45a50);
                  auVar171 = auVar162 ^ auVar174;
                  if (local_7f0 != (undefined1  [16])0x0) {
                    auVar162 = auVar162 ^ auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])local_7d0.hit);
                    *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar174;
                    auVar174 = vmaskmovps_avx(auVar162,*(undefined1 (*) [16])(local_7d0.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar174;
                  }
                }
                auVar164 = local_520;
                auVar107 = local_7a0;
                auVar210 = auVar145._0_32_;
                auVar226 = auVar167._0_32_;
                auVar127._8_8_ = 0x100000001;
                auVar127._0_8_ = 0x100000001;
                if ((auVar127 & auVar171) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_7a0._0_4_;
                }
                else {
                  local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_7a0._4_4_ = 0;
                  local_7a0._8_4_ = 0;
                  local_7a0._12_4_ = 0;
                }
                *(undefined4 *)(local_580 + uVar93 * 4) = 0;
                local_7a0._16_16_ = auVar107._16_16_;
                auVar117._4_4_ = local_7a0._0_4_;
                auVar117._0_4_ = local_7a0._0_4_;
                auVar117._8_4_ = local_7a0._0_4_;
                auVar117._12_4_ = local_7a0._0_4_;
                auVar117._16_4_ = local_7a0._0_4_;
                auVar117._20_4_ = local_7a0._0_4_;
                auVar117._24_4_ = local_7a0._0_4_;
                auVar117._28_4_ = local_7a0._0_4_;
                auVar115 = vcmpps_avx(auVar164,auVar117,2);
                auVar107 = vandps_avx(auVar115,local_580);
                local_580 = local_580 & auVar115;
                if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_580 >> 0x7f,0) == '\0') &&
                      (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_580 >> 0xbf,0) == '\0') &&
                    (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_580[0x1f]) break;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar164 = vblendvps_avx(auVar144,auVar164,auVar107);
                auVar115 = vshufps_avx(auVar164,auVar164,0xb1);
                auVar115 = vminps_avx(auVar164,auVar115);
                auVar157 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar157);
                auVar157 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar157);
                auVar115 = vcmpps_avx(auVar164,auVar115,0);
                auVar157 = auVar107 & auVar115;
                auVar164 = auVar107;
                if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar157 >> 0x7f,0) != '\0') ||
                      (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar157 >> 0xbf,0) != '\0') ||
                    (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar157[0x1f] < '\0') {
                  auVar164 = vandps_avx(auVar115,auVar107);
                }
                uVar89 = vmovmskps_avx(auVar164);
                uVar91 = 0;
                for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                  uVar91 = uVar91 + 1;
                }
                uVar93 = (ulong)uVar91;
                local_580 = auVar107;
              }
            }
          }
          auVar145 = ZEXT3264(local_6a0);
          auVar167 = ZEXT3264(local_5a0);
        }
      }
    }
    if (8 < iVar15) {
      local_4e0._4_4_ = iVar15;
      local_4e0._0_4_ = iVar15;
      fStack_4d8 = (float)iVar15;
      fStack_4d4 = (float)iVar15;
      fStack_4d0 = (float)iVar15;
      fStack_4cc = (float)iVar15;
      fStack_4c8 = (float)iVar15;
      iStack_4c4 = iVar15;
      local_320._4_4_ = fVar159;
      local_320._0_4_ = fVar159;
      fStack_318 = fVar159;
      fStack_314 = fVar159;
      fStack_310 = fVar159;
      fStack_30c = fVar159;
      fStack_308 = fVar159;
      fStack_304 = fVar159;
      local_100 = local_6e0._0_4_;
      uStack_fc = local_6e0._0_4_;
      uStack_f8 = local_6e0._0_4_;
      uStack_f4 = local_6e0._0_4_;
      uStack_f0 = local_6e0._0_4_;
      uStack_ec = local_6e0._0_4_;
      uStack_e8 = local_6e0._0_4_;
      uStack_e4 = local_6e0._0_4_;
      local_120 = 1.0 / (float)local_500._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_2b0 = local_460._0_4_;
      uStack_2ac = local_460._0_4_;
      uStack_2a8 = local_460._0_4_;
      uStack_2a4 = local_460._0_4_;
      local_2c0._4_4_ = local_480._0_4_;
      local_2c0._0_4_ = local_480._0_4_;
      local_2c0._8_4_ = local_480._0_4_;
      local_2c0._12_4_ = local_480._0_4_;
      auVar118 = ZEXT1664(local_2c0);
      _local_720 = auVar220._0_32_;
      local_7e0 = uVar94;
      fVar146 = (float)local_620;
      fVar159 = local_620._4_4_;
      fVar119 = (float)uStack_618;
      fVar120 = uStack_618._4_4_;
      fVar121 = (float)uStack_610;
      fVar122 = uStack_610._4_4_;
      fVar123 = (float)uStack_608;
      uVar97 = uStack_608._4_4_;
      local_780 = auVar210;
      local_6c0 = auVar226;
      local_600 = uVar99;
      uStack_5f8 = uVar125;
      uStack_5f0 = uVar222;
      uStack_5e8 = uVar223;
      for (lVar95 = 8; local_6a0 = auVar145._0_32_, lVar95 < lVar92; lVar95 = lVar95 + 8) {
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar95 * 4 + lVar98);
        auVar164 = *(undefined1 (*) [32])(lVar98 + 0x21fffac + lVar95 * 4);
        local_6e0 = *(undefined1 (*) [32])(lVar98 + 0x2200430 + lVar95 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar98 + 0x22008b4 + lVar95 * 4);
        fVar124 = *(float *)*pauVar2;
        fVar200 = *(float *)(*pauVar2 + 4);
        fVar201 = *(float *)(*pauVar2 + 8);
        fVar202 = *(float *)(*pauVar2 + 0xc);
        fVar211 = *(float *)(*pauVar2 + 0x10);
        fVar212 = *(float *)(*pauVar2 + 0x14);
        fVar213 = *(float *)(*pauVar2 + 0x18);
        auVar86 = *(undefined1 (*) [28])*pauVar2;
        auVar221._0_4_ = fVar124 * local_640;
        auVar221._4_4_ = fVar200 * fStack_63c;
        auVar221._8_4_ = fVar201 * fStack_638;
        auVar221._12_4_ = fVar202 * fStack_634;
        auVar221._16_4_ = fVar211 * fStack_630;
        auVar221._20_4_ = fVar212 * fStack_62c;
        auVar221._28_36_ = auVar220._28_36_;
        auVar221._24_4_ = fVar213 * fStack_628;
        auVar220._0_4_ = fVar124 * fVar146;
        auVar220._4_4_ = fVar200 * fVar159;
        auVar220._8_4_ = fVar201 * fVar119;
        auVar220._12_4_ = fVar202 * fVar120;
        auVar220._16_4_ = fVar211 * fVar121;
        auVar220._20_4_ = fVar212 * fVar122;
        auVar220._28_36_ = auVar118._28_36_;
        auVar220._24_4_ = fVar213 * fVar123;
        auVar171 = vfmadd231ps_fma(auVar221._0_32_,local_6e0,auVar167._0_32_);
        auVar174 = vfmadd231ps_fma(auVar220._0_32_,local_6e0,auVar199._0_32_);
        auVar128 = auVar207._0_32_;
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar164,auVar128);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar164,local_4a0);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar107,auVar225);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar107,local_440);
        auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar95 * 4 + lVar98);
        auVar157 = *(undefined1 (*) [32])(lVar98 + 0x22023cc + lVar95 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar98 + 0x2202850 + lVar95 * 4);
        pfVar1 = (float *)(lVar98 + 0x2202cd4 + lVar95 * 4);
        fVar224 = *pfVar1;
        fVar228 = pfVar1[1];
        fVar229 = pfVar1[2];
        fVar230 = pfVar1[3];
        fVar231 = pfVar1[4];
        fVar232 = pfVar1[5];
        fVar233 = pfVar1[6];
        auVar51._4_4_ = fStack_63c * fVar228;
        auVar51._0_4_ = local_640 * fVar224;
        auVar51._8_4_ = fStack_638 * fVar229;
        auVar51._12_4_ = fStack_634 * fVar230;
        auVar51._16_4_ = fStack_630 * fVar231;
        auVar51._20_4_ = fStack_62c * fVar232;
        auVar51._24_4_ = fStack_628 * fVar233;
        auVar51._28_4_ = local_440._28_4_;
        auVar52._4_4_ = fVar228 * fVar159;
        auVar52._0_4_ = fVar224 * fVar146;
        auVar52._8_4_ = fVar229 * fVar119;
        auVar52._12_4_ = fVar230 * fVar120;
        auVar52._16_4_ = fVar231 * fVar121;
        auVar52._20_4_ = fVar232 * fVar122;
        auVar52._24_4_ = fVar233 * fVar123;
        auVar52._28_4_ = uVar97;
        auVar162 = vfmadd231ps_fma(auVar51,auVar111,auVar167._0_32_);
        auVar7 = vfmadd231ps_fma(auVar52,auVar111,auVar199._0_32_);
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar157,auVar128);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar157,local_4a0);
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar115,auVar225);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar115,local_440);
        auVar131 = ZEXT1632(auVar162);
        local_5c0 = ZEXT1632(auVar171);
        _local_4c0 = vsubps_avx(auVar131,local_5c0);
        auVar139 = ZEXT1632(auVar7);
        local_5e0 = ZEXT1632(auVar174);
        local_2e0 = vsubps_avx(auVar139,local_5e0);
        auVar113._0_4_ = auVar174._0_4_ * local_4c0._0_4_;
        auVar113._4_4_ = auVar174._4_4_ * local_4c0._4_4_;
        auVar113._8_4_ = auVar174._8_4_ * local_4c0._8_4_;
        auVar113._12_4_ = auVar174._12_4_ * local_4c0._12_4_;
        auVar113._16_4_ = local_4c0._16_4_ * 0.0;
        auVar113._20_4_ = local_4c0._20_4_ * 0.0;
        auVar113._24_4_ = local_4c0._24_4_ * 0.0;
        auVar113._28_4_ = 0;
        fVar146 = local_2e0._0_4_;
        auVar140._0_4_ = auVar171._0_4_ * fVar146;
        fVar159 = local_2e0._4_4_;
        auVar140._4_4_ = auVar171._4_4_ * fVar159;
        fVar119 = local_2e0._8_4_;
        auVar140._8_4_ = auVar171._8_4_ * fVar119;
        fVar120 = local_2e0._12_4_;
        auVar140._12_4_ = auVar171._12_4_ * fVar120;
        fVar121 = local_2e0._16_4_;
        auVar140._16_4_ = fVar121 * 0.0;
        fVar122 = local_2e0._20_4_;
        auVar140._20_4_ = fVar122 * 0.0;
        fVar123 = local_2e0._24_4_;
        auVar140._24_4_ = fVar123 * 0.0;
        auVar140._28_4_ = 0;
        auVar220 = ZEXT3264(local_6e0);
        auVar114 = vsubps_avx(auVar113,auVar140);
        _local_300 = *pauVar2;
        auVar103 = _local_300;
        auVar53._4_4_ = local_600._4_4_ * fVar200;
        auVar53._0_4_ = (float)local_600 * fVar124;
        auVar53._8_4_ = (float)uStack_5f8 * fVar201;
        auVar53._12_4_ = uStack_5f8._4_4_ * fVar202;
        auVar53._16_4_ = (float)uStack_5f0 * fVar211;
        auVar53._20_4_ = uStack_5f0._4_4_ * fVar212;
        auVar53._24_4_ = (float)uStack_5e8 * fVar213;
        auVar53._28_4_ = 0;
        auVar171 = vfmadd231ps_fma(auVar53,local_6e0,local_e0);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar164,local_c0);
        auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),local_a0,auVar107);
        auVar54._4_4_ = local_600._4_4_ * fVar228;
        auVar54._0_4_ = (float)local_600 * fVar224;
        auVar54._8_4_ = (float)uStack_5f8 * fVar229;
        auVar54._12_4_ = uStack_5f8._4_4_ * fVar230;
        auVar54._16_4_ = (float)uStack_5f0 * fVar231;
        auVar54._20_4_ = uStack_5f0._4_4_ * fVar232;
        auVar54._24_4_ = (float)uStack_5e8 * fVar233;
        auVar54._28_4_ = uStack_5e8._4_4_;
        auVar174 = vfmadd231ps_fma(auVar54,auVar111,local_e0);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar157,local_c0);
        auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar115,local_a0);
        auVar145._0_4_ = fVar146 * fVar146;
        auVar145._4_4_ = fVar159 * fVar159;
        auVar145._8_4_ = fVar119 * fVar119;
        auVar145._12_4_ = fVar120 * fVar120;
        auVar145._16_4_ = fVar121 * fVar121;
        auVar145._20_4_ = fVar122 * fVar122;
        auVar145._28_36_ = auVar207._28_36_;
        auVar145._24_4_ = fVar123 * fVar123;
        auVar162 = vfmadd231ps_fma(auVar145._0_32_,_local_4c0,_local_4c0);
        auVar105 = ZEXT1632(auVar171);
        local_680 = ZEXT1632(auVar174);
        auVar136 = vmaxps_avx(auVar105,local_680);
        auVar205._0_4_ = auVar136._0_4_ * auVar136._0_4_ * auVar162._0_4_;
        auVar205._4_4_ = auVar136._4_4_ * auVar136._4_4_ * auVar162._4_4_;
        auVar205._8_4_ = auVar136._8_4_ * auVar136._8_4_ * auVar162._8_4_;
        auVar205._12_4_ = auVar136._12_4_ * auVar136._12_4_ * auVar162._12_4_;
        auVar205._16_4_ = auVar136._16_4_ * auVar136._16_4_ * 0.0;
        auVar205._20_4_ = auVar136._20_4_ * auVar136._20_4_ * 0.0;
        auVar205._24_4_ = auVar136._24_4_ * auVar136._24_4_ * 0.0;
        auVar205._28_4_ = 0;
        auVar55._4_4_ = auVar114._4_4_ * auVar114._4_4_;
        auVar55._0_4_ = auVar114._0_4_ * auVar114._0_4_;
        auVar55._8_4_ = auVar114._8_4_ * auVar114._8_4_;
        auVar55._12_4_ = auVar114._12_4_ * auVar114._12_4_;
        auVar55._16_4_ = auVar114._16_4_ * auVar114._16_4_;
        auVar55._20_4_ = auVar114._20_4_ * auVar114._20_4_;
        auVar55._24_4_ = auVar114._24_4_ * auVar114._24_4_;
        auVar55._28_4_ = auVar114._28_4_;
        auVar136 = vcmpps_avx(auVar55,auVar205,2);
        local_240 = (int)lVar95;
        auVar206._4_4_ = local_240;
        auVar206._0_4_ = local_240;
        auVar206._8_4_ = local_240;
        auVar206._12_4_ = local_240;
        auVar206._16_4_ = local_240;
        auVar206._20_4_ = local_240;
        auVar206._24_4_ = local_240;
        auVar206._28_4_ = local_240;
        auVar114 = vpor_avx2(auVar206,_DAT_01fb4ba0);
        auVar118 = ZEXT3264(_local_4e0);
        auVar102 = vpcmpgtd_avx2(_local_4e0,auVar114);
        auVar114 = auVar102 & auVar136;
        fVar146 = (float)local_620;
        fVar159 = local_620._4_4_;
        fVar119 = (float)uStack_618;
        fVar120 = uStack_618._4_4_;
        fVar121 = (float)uStack_610;
        fVar122 = uStack_610._4_4_;
        fVar123 = (float)uStack_608;
        uVar97 = uStack_608._4_4_;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
          auVar145 = ZEXT3264(local_6a0);
          auVar199 = ZEXT3264(local_760);
          auVar207 = ZEXT3264(auVar128);
        }
        else {
          local_460 = vandps_avx(auVar102,auVar136);
          auVar56._4_4_ = (float)local_720._4_4_ * fVar228;
          auVar56._0_4_ = (float)local_720._0_4_ * fVar224;
          auVar56._8_4_ = fStack_718 * fVar229;
          auVar56._12_4_ = fStack_714 * fVar230;
          auVar56._16_4_ = fStack_710 * fVar231;
          auVar56._20_4_ = fStack_70c * fVar232;
          auVar56._24_4_ = fStack_708 * fVar233;
          auVar56._28_4_ = auVar136._28_4_;
          auVar171 = vfmadd213ps_fma(auVar111,local_6c0,auVar56);
          auVar171 = vfmadd213ps_fma(auVar157,local_740,ZEXT1632(auVar171));
          auVar171 = vfmadd213ps_fma(auVar115,local_780,ZEXT1632(auVar171));
          local_480 = ZEXT1632(auVar171);
          local_300._0_4_ = auVar86._0_4_;
          local_300._4_4_ = auVar86._4_4_;
          fStack_2f8 = auVar86._8_4_;
          fStack_2f4 = auVar86._12_4_;
          fStack_2f0 = auVar86._16_4_;
          fStack_2ec = auVar86._20_4_;
          fStack_2e8 = auVar86._24_4_;
          auVar57._4_4_ = (float)local_720._4_4_ * (float)local_300._4_4_;
          auVar57._0_4_ = (float)local_720._0_4_ * (float)local_300._0_4_;
          auVar57._8_4_ = fStack_718 * fStack_2f8;
          auVar57._12_4_ = fStack_714 * fStack_2f4;
          auVar57._16_4_ = fStack_710 * fStack_2f0;
          auVar57._20_4_ = fStack_70c * fStack_2ec;
          auVar57._24_4_ = fStack_708 * fStack_2e8;
          auVar57._28_4_ = auVar136._28_4_;
          auVar171 = vfmadd213ps_fma(local_6e0,local_6c0,auVar57);
          auVar171 = vfmadd213ps_fma(auVar164,local_740,ZEXT1632(auVar171));
          auVar164 = *(undefined1 (*) [32])(lVar98 + 0x2200d38 + lVar95 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar98 + 0x22011bc + lVar95 * 4);
          auVar157 = *(undefined1 (*) [32])(lVar98 + 0x2201640 + lVar95 * 4);
          pfVar3 = (float *)(lVar98 + 0x2201ac4 + lVar95 * 4);
          fVar124 = *pfVar3;
          fVar200 = pfVar3[1];
          fVar201 = pfVar3[2];
          fVar202 = pfVar3[3];
          fVar211 = pfVar3[4];
          fVar212 = pfVar3[5];
          fVar213 = pfVar3[6];
          auVar58._4_4_ = fVar200 * fStack_63c;
          auVar58._0_4_ = fVar124 * local_640;
          auVar58._8_4_ = fVar201 * fStack_638;
          auVar58._12_4_ = fVar202 * fStack_634;
          auVar58._16_4_ = fVar211 * fStack_630;
          auVar58._20_4_ = fVar212 * fStack_62c;
          auVar58._24_4_ = fVar213 * fStack_628;
          auVar58._28_4_ = pfVar1[7];
          auVar218._0_4_ = fVar124 * (float)local_620;
          auVar218._4_4_ = fVar200 * local_620._4_4_;
          auVar218._8_4_ = fVar201 * (float)uStack_618;
          auVar218._12_4_ = fVar202 * uStack_618._4_4_;
          auVar218._16_4_ = fVar211 * (float)uStack_610;
          auVar218._20_4_ = fVar212 * uStack_610._4_4_;
          auVar218._24_4_ = fVar213 * (float)uStack_608;
          auVar218._28_4_ = 0;
          auVar59._4_4_ = (float)local_720._4_4_ * fVar200;
          auVar59._0_4_ = (float)local_720._0_4_ * fVar124;
          auVar59._8_4_ = fStack_718 * fVar201;
          auVar59._12_4_ = fStack_714 * fVar202;
          auVar59._16_4_ = fStack_710 * fVar211;
          auVar59._20_4_ = fStack_70c * fVar212;
          auVar59._24_4_ = fStack_708 * fVar213;
          auVar59._28_4_ = pfVar3[7];
          auVar174 = vfmadd231ps_fma(auVar58,auVar157,local_5a0);
          auVar162 = vfmadd231ps_fma(auVar218,auVar157,local_760);
          auVar7 = vfmadd231ps_fma(auVar59,local_6c0,auVar157);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar115,auVar128);
          auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar115,local_4a0);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_740,auVar115);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar164,auVar225);
          auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar164,local_440);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_780,auVar164);
          pfVar1 = (float *)(lVar98 + 0x2203ee4 + lVar95 * 4);
          fVar124 = *pfVar1;
          fVar200 = pfVar1[1];
          fVar201 = pfVar1[2];
          fVar202 = pfVar1[3];
          fVar211 = pfVar1[4];
          fVar212 = pfVar1[5];
          fVar213 = pfVar1[6];
          auVar60._4_4_ = fStack_63c * fVar200;
          auVar60._0_4_ = local_640 * fVar124;
          auVar60._8_4_ = fStack_638 * fVar201;
          auVar60._12_4_ = fStack_634 * fVar202;
          auVar60._16_4_ = fStack_630 * fVar211;
          auVar60._20_4_ = fStack_62c * fVar212;
          auVar60._24_4_ = fStack_628 * fVar213;
          auVar60._28_4_ = local_780._28_4_;
          auVar61._4_4_ = local_620._4_4_ * fVar200;
          auVar61._0_4_ = (float)local_620 * fVar124;
          auVar61._8_4_ = (float)uStack_618 * fVar201;
          auVar61._12_4_ = uStack_618._4_4_ * fVar202;
          auVar61._16_4_ = (float)uStack_610 * fVar211;
          auVar61._20_4_ = uStack_610._4_4_ * fVar212;
          auVar61._24_4_ = (float)uStack_608 * fVar213;
          auVar61._28_4_ = auVar207._28_4_;
          auVar62._4_4_ = fVar200 * (float)local_720._4_4_;
          auVar62._0_4_ = fVar124 * (float)local_720._0_4_;
          auVar62._8_4_ = fVar201 * fStack_718;
          auVar62._12_4_ = fVar202 * fStack_714;
          auVar62._16_4_ = fVar211 * fStack_710;
          auVar62._20_4_ = fVar212 * fStack_70c;
          auVar62._24_4_ = fVar213 * fStack_708;
          auVar62._28_4_ = pfVar1[7];
          auVar164 = *(undefined1 (*) [32])(lVar98 + 0x2203a60 + lVar95 * 4);
          auVar8 = vfmadd231ps_fma(auVar60,auVar164,local_5a0);
          auVar12 = vfmadd231ps_fma(auVar61,auVar164,local_760);
          auVar193 = vfmadd231ps_fma(auVar62,local_6c0,auVar164);
          auVar164 = *(undefined1 (*) [32])(lVar98 + 0x22035dc + lVar95 * 4);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar164,auVar128);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar164,local_4a0);
          auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),auVar164,local_740);
          auVar164 = *(undefined1 (*) [32])(lVar98 + 0x2203158 + lVar95 * 4);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar164,auVar225);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar164,local_440);
          auVar193 = vfmadd231ps_fma(ZEXT1632(auVar193),local_780,auVar164);
          auVar164 = vandps_avx(ZEXT1632(auVar174),local_160);
          auVar115 = vandps_avx(ZEXT1632(auVar162),local_160);
          auVar115 = vmaxps_avx(auVar164,auVar115);
          auVar164 = vandps_avx(ZEXT1632(auVar7),local_160);
          auVar164 = vmaxps_avx(auVar115,auVar164);
          auVar164 = vcmpps_avx(auVar164,_local_320,1);
          auVar157 = vblendvps_avx(ZEXT1632(auVar174),_local_4c0,auVar164);
          auVar111 = vblendvps_avx(ZEXT1632(auVar162),local_2e0,auVar164);
          auVar164 = vandps_avx(ZEXT1632(auVar8),local_160);
          auVar115 = vandps_avx(ZEXT1632(auVar12),local_160);
          auVar115 = vmaxps_avx(auVar164,auVar115);
          auVar164 = vandps_avx(local_160,ZEXT1632(auVar193));
          auVar164 = vmaxps_avx(auVar115,auVar164);
          auVar115 = vcmpps_avx(auVar164,_local_320,1);
          auVar164 = vblendvps_avx(ZEXT1632(auVar8),_local_4c0,auVar115);
          auVar115 = vblendvps_avx(ZEXT1632(auVar12),local_2e0,auVar115);
          auVar171 = vfmadd213ps_fma(auVar107,local_780,ZEXT1632(auVar171));
          auVar174 = vfmadd213ps_fma(auVar157,auVar157,ZEXT832(0) << 0x20);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar111,auVar111);
          auVar107 = vrsqrtps_avx(ZEXT1632(auVar174));
          fVar124 = auVar107._0_4_;
          fVar200 = auVar107._4_4_;
          fVar201 = auVar107._8_4_;
          fVar202 = auVar107._12_4_;
          fVar211 = auVar107._16_4_;
          fVar212 = auVar107._20_4_;
          fVar213 = auVar107._24_4_;
          auVar63._4_4_ = fVar200 * fVar200 * fVar200 * auVar174._4_4_ * -0.5;
          auVar63._0_4_ = fVar124 * fVar124 * fVar124 * auVar174._0_4_ * -0.5;
          auVar63._8_4_ = fVar201 * fVar201 * fVar201 * auVar174._8_4_ * -0.5;
          auVar63._12_4_ = fVar202 * fVar202 * fVar202 * auVar174._12_4_ * -0.5;
          auVar63._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
          auVar63._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
          auVar63._24_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar63._28_4_ = 0;
          auVar183._8_4_ = 0x3fc00000;
          auVar183._0_8_ = 0x3fc000003fc00000;
          auVar183._12_4_ = 0x3fc00000;
          auVar183._16_4_ = 0x3fc00000;
          auVar183._20_4_ = 0x3fc00000;
          auVar183._24_4_ = 0x3fc00000;
          auVar183._28_4_ = 0x3fc00000;
          auVar174 = vfmadd231ps_fma(auVar63,auVar183,auVar107);
          fVar124 = auVar174._0_4_;
          fVar200 = auVar174._4_4_;
          auVar64._4_4_ = auVar111._4_4_ * fVar200;
          auVar64._0_4_ = auVar111._0_4_ * fVar124;
          fVar201 = auVar174._8_4_;
          auVar64._8_4_ = auVar111._8_4_ * fVar201;
          fVar202 = auVar174._12_4_;
          auVar64._12_4_ = auVar111._12_4_ * fVar202;
          auVar64._16_4_ = auVar111._16_4_ * 0.0;
          auVar64._20_4_ = auVar111._20_4_ * 0.0;
          auVar64._24_4_ = auVar111._24_4_ * 0.0;
          auVar64._28_4_ = auVar111._28_4_;
          auVar65._4_4_ = fVar200 * -auVar157._4_4_;
          auVar65._0_4_ = fVar124 * -auVar157._0_4_;
          auVar65._8_4_ = fVar201 * -auVar157._8_4_;
          auVar65._12_4_ = fVar202 * -auVar157._12_4_;
          auVar65._16_4_ = -auVar157._16_4_ * 0.0;
          auVar65._20_4_ = -auVar157._20_4_ * 0.0;
          auVar65._24_4_ = -auVar157._24_4_ * 0.0;
          auVar65._28_4_ = auVar107._28_4_;
          auVar174 = vfmadd213ps_fma(auVar164,auVar164,ZEXT832(0) << 0x20);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar115,auVar115);
          auVar107 = vrsqrtps_avx(ZEXT1632(auVar174));
          auVar66._28_4_ = local_4c0._28_4_;
          auVar66._0_28_ =
               ZEXT1628(CONCAT412(fVar202 * 0.0,
                                  CONCAT48(fVar201 * 0.0,CONCAT44(fVar200 * 0.0,fVar124 * 0.0))));
          fVar124 = auVar107._0_4_;
          fVar200 = auVar107._4_4_;
          fVar201 = auVar107._8_4_;
          fVar202 = auVar107._12_4_;
          fVar211 = auVar107._16_4_;
          fVar212 = auVar107._20_4_;
          fVar213 = auVar107._24_4_;
          auVar67._4_4_ = fVar200 * fVar200 * fVar200 * auVar174._4_4_ * -0.5;
          auVar67._0_4_ = fVar124 * fVar124 * fVar124 * auVar174._0_4_ * -0.5;
          auVar67._8_4_ = fVar201 * fVar201 * fVar201 * auVar174._8_4_ * -0.5;
          auVar67._12_4_ = fVar202 * fVar202 * fVar202 * auVar174._12_4_ * -0.5;
          auVar67._16_4_ = fVar211 * fVar211 * fVar211 * -0.0;
          auVar67._20_4_ = fVar212 * fVar212 * fVar212 * -0.0;
          auVar67._24_4_ = fVar213 * fVar213 * fVar213 * -0.0;
          auVar67._28_4_ = 0;
          auVar174 = vfmadd231ps_fma(auVar67,auVar183,auVar107);
          fVar124 = auVar174._0_4_;
          fVar200 = auVar174._4_4_;
          auVar68._4_4_ = auVar115._4_4_ * fVar200;
          auVar68._0_4_ = auVar115._0_4_ * fVar124;
          fVar201 = auVar174._8_4_;
          auVar68._8_4_ = auVar115._8_4_ * fVar201;
          fVar202 = auVar174._12_4_;
          auVar68._12_4_ = auVar115._12_4_ * fVar202;
          auVar68._16_4_ = auVar115._16_4_ * 0.0;
          auVar68._20_4_ = auVar115._20_4_ * 0.0;
          auVar68._24_4_ = auVar115._24_4_ * 0.0;
          auVar68._28_4_ = 0;
          auVar69._4_4_ = fVar200 * -auVar164._4_4_;
          auVar69._0_4_ = fVar124 * -auVar164._0_4_;
          auVar69._8_4_ = fVar201 * -auVar164._8_4_;
          auVar69._12_4_ = fVar202 * -auVar164._12_4_;
          auVar69._16_4_ = -auVar164._16_4_ * 0.0;
          auVar69._20_4_ = -auVar164._20_4_ * 0.0;
          auVar69._24_4_ = -auVar164._24_4_ * 0.0;
          auVar69._28_4_ = 0;
          auVar70._28_4_ = 0xbf000000;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar202 * 0.0,
                                  CONCAT48(fVar201 * 0.0,CONCAT44(fVar200 * 0.0,fVar124 * 0.0))));
          auVar174 = vfmadd213ps_fma(auVar64,auVar105,local_5c0);
          auVar162 = vfmadd213ps_fma(auVar65,auVar105,local_5e0);
          auVar7 = vfmadd213ps_fma(auVar66,auVar105,ZEXT1632(auVar171));
          auVar100 = vfnmadd213ps_fma(auVar64,auVar105,local_5c0);
          auVar8 = vfmadd213ps_fma(auVar68,local_680,auVar131);
          auVar147 = vfnmadd213ps_fma(auVar65,auVar105,local_5e0);
          auVar12 = vfmadd213ps_fma(auVar69,local_680,auVar139);
          auVar171 = vfnmadd231ps_fma(ZEXT1632(auVar171),auVar105,auVar66);
          auVar193 = vfmadd213ps_fma(auVar70,local_680,local_480);
          auVar101 = vfnmadd213ps_fma(auVar68,local_680,auVar131);
          auVar160 = vfnmadd213ps_fma(auVar69,local_680,auVar139);
          auVar161 = vfnmadd231ps_fma(local_480,local_680,auVar70);
          auVar107 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar147));
          auVar164 = vsubps_avx(ZEXT1632(auVar193),ZEXT1632(auVar171));
          auVar71._4_4_ = auVar107._4_4_ * auVar171._4_4_;
          auVar71._0_4_ = auVar107._0_4_ * auVar171._0_4_;
          auVar71._8_4_ = auVar107._8_4_ * auVar171._8_4_;
          auVar71._12_4_ = auVar107._12_4_ * auVar171._12_4_;
          auVar71._16_4_ = auVar107._16_4_ * 0.0;
          auVar71._20_4_ = auVar107._20_4_ * 0.0;
          auVar71._24_4_ = auVar107._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar214 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar147),auVar164);
          auVar72._4_4_ = auVar100._4_4_ * auVar164._4_4_;
          auVar72._0_4_ = auVar100._0_4_ * auVar164._0_4_;
          auVar72._8_4_ = auVar100._8_4_ * auVar164._8_4_;
          auVar72._12_4_ = auVar100._12_4_ * auVar164._12_4_;
          auVar72._16_4_ = auVar164._16_4_ * 0.0;
          auVar72._20_4_ = auVar164._20_4_ * 0.0;
          auVar72._24_4_ = auVar164._24_4_ * 0.0;
          auVar72._28_4_ = auVar164._28_4_;
          auVar111 = ZEXT1632(auVar100);
          auVar164 = vsubps_avx(ZEXT1632(auVar8),auVar111);
          auVar114 = ZEXT1632(auVar171);
          auVar171 = vfmsub231ps_fma(auVar72,auVar114,auVar164);
          auVar73._4_4_ = auVar147._4_4_ * auVar164._4_4_;
          auVar73._0_4_ = auVar147._0_4_ * auVar164._0_4_;
          auVar73._8_4_ = auVar147._8_4_ * auVar164._8_4_;
          auVar73._12_4_ = auVar147._12_4_ * auVar164._12_4_;
          auVar73._16_4_ = auVar164._16_4_ * 0.0;
          auVar73._20_4_ = auVar164._20_4_ * 0.0;
          auVar73._24_4_ = auVar164._24_4_ * 0.0;
          auVar73._28_4_ = auVar164._28_4_;
          auVar100 = vfmsub231ps_fma(auVar73,auVar111,auVar107);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT832(0) << 0x20,ZEXT1632(auVar171));
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),ZEXT832(0) << 0x20,ZEXT1632(auVar214));
          auVar102 = vcmpps_avx(ZEXT1632(auVar171),ZEXT832(0) << 0x20,2);
          local_6e0 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar174),auVar102);
          auVar107 = vblendvps_avx(ZEXT1632(auVar160),ZEXT1632(auVar162),auVar102);
          local_7a0 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar7),auVar102);
          auVar164 = vblendvps_avx(auVar111,ZEXT1632(auVar8),auVar102);
          auVar115 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar12),auVar102);
          auVar157 = vblendvps_avx(auVar114,ZEXT1632(auVar193),auVar102);
          auVar111 = vblendvps_avx(ZEXT1632(auVar8),auVar111,auVar102);
          auVar136 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar147),auVar102);
          auVar171 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
          auVar114 = vblendvps_avx(ZEXT1632(auVar193),auVar114,auVar102);
          auVar118 = ZEXT864(0) << 0x20;
          auVar111 = vsubps_avx(auVar111,local_6e0);
          auVar136 = vsubps_avx(auVar136,auVar107);
          auVar139 = vsubps_avx(auVar114,local_7a0);
          auVar220 = ZEXT3264(auVar139);
          auVar131 = vsubps_avx(local_6e0,auVar164);
          auVar128 = vsubps_avx(auVar107,auVar115);
          auVar129 = vsubps_avx(local_7a0,auVar157);
          auVar185._0_4_ = auVar139._0_4_ * local_6e0._0_4_;
          auVar185._4_4_ = auVar139._4_4_ * local_6e0._4_4_;
          auVar185._8_4_ = auVar139._8_4_ * local_6e0._8_4_;
          auVar185._12_4_ = auVar139._12_4_ * local_6e0._12_4_;
          auVar185._16_4_ = auVar139._16_4_ * local_6e0._16_4_;
          auVar185._20_4_ = auVar139._20_4_ * local_6e0._20_4_;
          auVar185._24_4_ = auVar139._24_4_ * local_6e0._24_4_;
          auVar185._28_4_ = 0;
          auVar174 = vfmsub231ps_fma(auVar185,local_7a0,auVar111);
          auVar74._4_4_ = auVar111._4_4_ * auVar107._4_4_;
          auVar74._0_4_ = auVar111._0_4_ * auVar107._0_4_;
          auVar74._8_4_ = auVar111._8_4_ * auVar107._8_4_;
          auVar74._12_4_ = auVar111._12_4_ * auVar107._12_4_;
          auVar74._16_4_ = auVar111._16_4_ * auVar107._16_4_;
          auVar74._20_4_ = auVar111._20_4_ * auVar107._20_4_;
          auVar74._24_4_ = auVar111._24_4_ * auVar107._24_4_;
          auVar74._28_4_ = auVar114._28_4_;
          auVar162 = vfmsub231ps_fma(auVar74,local_6e0,auVar136);
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar162),ZEXT832(0) << 0x20,ZEXT1632(auVar174));
          auVar186._0_4_ = auVar136._0_4_ * local_7a0._0_4_;
          auVar186._4_4_ = auVar136._4_4_ * local_7a0._4_4_;
          auVar186._8_4_ = auVar136._8_4_ * local_7a0._8_4_;
          auVar186._12_4_ = auVar136._12_4_ * local_7a0._12_4_;
          auVar186._16_4_ = auVar136._16_4_ * local_7a0._16_4_;
          auVar186._20_4_ = auVar136._20_4_ * local_7a0._20_4_;
          auVar186._24_4_ = auVar136._24_4_ * local_7a0._24_4_;
          auVar186._28_4_ = 0;
          auVar162 = vfmsub231ps_fma(auVar186,auVar107,auVar139);
          auVar162 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT832(0) << 0x20,ZEXT1632(auVar162));
          auVar187._0_4_ = auVar129._0_4_ * auVar164._0_4_;
          auVar187._4_4_ = auVar129._4_4_ * auVar164._4_4_;
          auVar187._8_4_ = auVar129._8_4_ * auVar164._8_4_;
          auVar187._12_4_ = auVar129._12_4_ * auVar164._12_4_;
          auVar187._16_4_ = auVar129._16_4_ * auVar164._16_4_;
          auVar187._20_4_ = auVar129._20_4_ * auVar164._20_4_;
          auVar187._24_4_ = auVar129._24_4_ * auVar164._24_4_;
          auVar187._28_4_ = 0;
          auVar174 = vfmsub231ps_fma(auVar187,auVar131,auVar157);
          auVar75._4_4_ = auVar128._4_4_ * auVar157._4_4_;
          auVar75._0_4_ = auVar128._0_4_ * auVar157._0_4_;
          auVar75._8_4_ = auVar128._8_4_ * auVar157._8_4_;
          auVar75._12_4_ = auVar128._12_4_ * auVar157._12_4_;
          auVar75._16_4_ = auVar128._16_4_ * auVar157._16_4_;
          auVar75._20_4_ = auVar128._20_4_ * auVar157._20_4_;
          auVar75._24_4_ = auVar128._24_4_ * auVar157._24_4_;
          auVar75._28_4_ = local_6e0._28_4_;
          auVar7 = vfmsub231ps_fma(auVar75,auVar115,auVar129);
          auVar76._4_4_ = auVar131._4_4_ * auVar115._4_4_;
          auVar76._0_4_ = auVar131._0_4_ * auVar115._0_4_;
          auVar76._8_4_ = auVar131._8_4_ * auVar115._8_4_;
          auVar76._12_4_ = auVar131._12_4_ * auVar115._12_4_;
          auVar76._16_4_ = auVar131._16_4_ * auVar115._16_4_;
          auVar76._20_4_ = auVar131._20_4_ * auVar115._20_4_;
          auVar76._24_4_ = auVar131._24_4_ * auVar115._24_4_;
          auVar76._28_4_ = auVar115._28_4_;
          auVar8 = vfmsub231ps_fma(auVar76,auVar128,auVar164);
          auVar115 = ZEXT832(0) << 0x20;
          auVar174 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar115,ZEXT1632(auVar174));
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar174),auVar115,ZEXT1632(auVar7));
          auVar164 = vmaxps_avx(ZEXT1632(auVar162),ZEXT1632(auVar7));
          auVar164 = vcmpps_avx(auVar164,auVar115,2);
          auVar174 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar171 = vpand_avx(auVar174,auVar171);
          auVar164 = vpmovsxwd_avx2(auVar171);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar164[0x1f]) {
LAB_01408e97:
            auVar166._8_8_ = uStack_538;
            auVar166._0_8_ = local_540;
            auVar166._16_8_ = uStack_530;
            auVar166._24_8_ = uStack_528;
          }
          else {
            auVar77._4_4_ = auVar136._4_4_ * auVar129._4_4_;
            auVar77._0_4_ = auVar136._0_4_ * auVar129._0_4_;
            auVar77._8_4_ = auVar136._8_4_ * auVar129._8_4_;
            auVar77._12_4_ = auVar136._12_4_ * auVar129._12_4_;
            auVar77._16_4_ = auVar136._16_4_ * auVar129._16_4_;
            auVar77._20_4_ = auVar136._20_4_ * auVar129._20_4_;
            auVar77._24_4_ = auVar136._24_4_ * auVar129._24_4_;
            auVar77._28_4_ = auVar164._28_4_;
            auVar193 = vfmsub231ps_fma(auVar77,auVar128,auVar139);
            auVar192._0_4_ = auVar139._0_4_ * auVar131._0_4_;
            auVar192._4_4_ = auVar139._4_4_ * auVar131._4_4_;
            auVar192._8_4_ = auVar139._8_4_ * auVar131._8_4_;
            auVar192._12_4_ = auVar139._12_4_ * auVar131._12_4_;
            auVar192._16_4_ = auVar139._16_4_ * auVar131._16_4_;
            auVar192._20_4_ = auVar139._20_4_ * auVar131._20_4_;
            auVar192._24_4_ = auVar139._24_4_ * auVar131._24_4_;
            auVar192._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar192,auVar111,auVar129);
            auVar78._4_4_ = auVar111._4_4_ * auVar128._4_4_;
            auVar78._0_4_ = auVar111._0_4_ * auVar128._0_4_;
            auVar78._8_4_ = auVar111._8_4_ * auVar128._8_4_;
            auVar78._12_4_ = auVar111._12_4_ * auVar128._12_4_;
            auVar78._16_4_ = auVar111._16_4_ * auVar128._16_4_;
            auVar78._20_4_ = auVar111._20_4_ * auVar128._20_4_;
            auVar78._24_4_ = auVar111._24_4_ * auVar128._24_4_;
            auVar78._28_4_ = auVar128._28_4_;
            auVar214 = vfmsub231ps_fma(auVar78,auVar131,auVar136);
            auVar174 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar214));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar174),ZEXT1632(auVar193),auVar115);
            auVar164 = vrcpps_avx(ZEXT1632(auVar8));
            auVar219._8_4_ = 0x3f800000;
            auVar219._0_8_ = 0x3f8000003f800000;
            auVar219._12_4_ = 0x3f800000;
            auVar219._16_4_ = 0x3f800000;
            auVar219._20_4_ = 0x3f800000;
            auVar219._24_4_ = 0x3f800000;
            auVar219._28_4_ = 0x3f800000;
            auVar220 = ZEXT3264(auVar219);
            auVar174 = vfnmadd213ps_fma(auVar164,ZEXT1632(auVar8),auVar219);
            auVar174 = vfmadd132ps_fma(ZEXT1632(auVar174),auVar164,auVar164);
            auVar79._4_4_ = auVar214._4_4_ * local_7a0._4_4_;
            auVar79._0_4_ = auVar214._0_4_ * local_7a0._0_4_;
            auVar79._8_4_ = auVar214._8_4_ * local_7a0._8_4_;
            auVar79._12_4_ = auVar214._12_4_ * local_7a0._12_4_;
            auVar79._16_4_ = local_7a0._16_4_ * 0.0;
            auVar79._20_4_ = local_7a0._20_4_ * 0.0;
            auVar79._24_4_ = local_7a0._24_4_ * 0.0;
            auVar79._28_4_ = auVar107._28_4_;
            auVar12 = vfmadd231ps_fma(auVar79,ZEXT1632(auVar12),auVar107);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar193),local_6e0);
            fVar124 = auVar174._0_4_;
            fVar200 = auVar174._4_4_;
            fVar201 = auVar174._8_4_;
            fVar202 = auVar174._12_4_;
            auVar115 = ZEXT1632(CONCAT412(fVar202 * auVar12._12_4_,
                                          CONCAT48(fVar201 * auVar12._8_4_,
                                                   CONCAT44(fVar200 * auVar12._4_4_,
                                                            fVar124 * auVar12._0_4_))));
            uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar165._4_4_ = uVar4;
            auVar165._0_4_ = uVar4;
            auVar165._8_4_ = uVar4;
            auVar165._12_4_ = uVar4;
            auVar165._16_4_ = uVar4;
            auVar165._20_4_ = uVar4;
            auVar165._24_4_ = uVar4;
            auVar165._28_4_ = uVar4;
            auVar85._4_4_ = uStack_fc;
            auVar85._0_4_ = local_100;
            auVar85._8_4_ = uStack_f8;
            auVar85._12_4_ = uStack_f4;
            auVar85._16_4_ = uStack_f0;
            auVar85._20_4_ = uStack_ec;
            auVar85._24_4_ = uStack_e8;
            auVar85._28_4_ = uStack_e4;
            auVar118 = ZEXT3264(auVar85);
            auVar107 = vcmpps_avx(auVar85,auVar115,2);
            auVar164 = vcmpps_avx(auVar115,auVar165,2);
            auVar107 = vandps_avx(auVar164,auVar107);
            auVar174 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
            auVar171 = vpand_avx(auVar171,auVar174);
            auVar107 = vpmovsxwd_avx2(auVar171);
            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar107 >> 0x7f,0) == '\0') &&
                  (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0xbf,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar107[0x1f]) goto LAB_01408e97;
            auVar107 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,4);
            auVar174 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
            auVar171 = vpand_avx(auVar171,auVar174);
            auVar107 = vpmovsxwd_avx2(auVar171);
            auVar166._8_8_ = uStack_538;
            auVar166._0_8_ = local_540;
            auVar166._16_8_ = uStack_530;
            auVar166._24_8_ = uStack_528;
            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar107 >> 0x7f,0) != '\0') ||
                  (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar107 >> 0xbf,0) != '\0') ||
                (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar107[0x1f] < '\0') {
              auVar157 = ZEXT1632(CONCAT412(fVar202 * auVar162._12_4_,
                                            CONCAT48(fVar201 * auVar162._8_4_,
                                                     CONCAT44(fVar200 * auVar162._4_4_,
                                                              fVar124 * auVar162._0_4_))));
              auVar80._28_4_ = SUB84(uStack_528,4);
              auVar80._0_28_ =
                   ZEXT1628(CONCAT412(fVar202 * auVar7._12_4_,
                                      CONCAT48(fVar201 * auVar7._8_4_,
                                               CONCAT44(fVar200 * auVar7._4_4_,
                                                        fVar124 * auVar7._0_4_))));
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = 0x3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar198,auVar157);
              local_6a0 = vblendvps_avx(auVar164,auVar157,auVar102);
              auVar164 = vsubps_avx(auVar198,auVar80);
              local_380 = vblendvps_avx(auVar164,auVar80,auVar102);
              local_360 = auVar115;
              auVar166 = auVar107;
            }
          }
          auVar207 = ZEXT3264(local_660);
          local_500 = auVar105;
          if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0x7f,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0xbf,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar166[0x1f]) {
            auVar145 = ZEXT3264(local_6a0);
            auVar199 = ZEXT3264(local_760);
          }
          else {
            auVar107 = vsubps_avx(local_680,auVar105);
            auVar171 = vfmadd213ps_fma(auVar107,local_6a0,auVar105);
            fVar124 = *(float *)((long)local_6e8->ray_space + k * 4 + -0x10);
            auVar81._4_4_ = (auVar171._4_4_ + auVar171._4_4_) * fVar124;
            auVar81._0_4_ = (auVar171._0_4_ + auVar171._0_4_) * fVar124;
            auVar81._8_4_ = (auVar171._8_4_ + auVar171._8_4_) * fVar124;
            auVar81._12_4_ = (auVar171._12_4_ + auVar171._12_4_) * fVar124;
            auVar81._16_4_ = fVar124 * 0.0;
            auVar81._20_4_ = fVar124 * 0.0;
            auVar81._24_4_ = fVar124 * 0.0;
            auVar81._28_4_ = fVar124;
            auVar107 = vcmpps_avx(local_360,auVar81,6);
            auVar118 = ZEXT3264(auVar107);
            auVar164 = auVar166 & auVar107;
            auVar199 = ZEXT3264(local_760);
            if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar164 >> 0x7f,0) != '\0') ||
                  (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0xbf,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar164[0x1f] < '\0') {
              auVar141._8_4_ = 0xbf800000;
              auVar141._0_8_ = 0xbf800000bf800000;
              auVar141._12_4_ = 0xbf800000;
              auVar141._16_4_ = 0xbf800000;
              auVar141._20_4_ = 0xbf800000;
              auVar141._24_4_ = 0xbf800000;
              auVar141._28_4_ = 0xbf800000;
              auVar158._8_4_ = 0x40000000;
              auVar158._0_8_ = 0x4000000040000000;
              auVar158._12_4_ = 0x40000000;
              auVar158._16_4_ = 0x40000000;
              auVar158._20_4_ = 0x40000000;
              auVar158._24_4_ = 0x40000000;
              auVar158._28_4_ = 0x40000000;
              auVar171 = vfmadd213ps_fma(local_380,auVar158,auVar141);
              local_2a0 = local_6a0;
              local_380 = ZEXT1632(auVar171);
              auVar164 = local_380;
              local_280 = ZEXT1632(auVar171);
              local_260 = local_360;
              local_23c = iVar15;
              local_230 = local_800;
              uStack_228 = uStack_7f8;
              local_220 = local_810;
              uStack_218 = uStack_808;
              local_210 = local_820;
              uStack_208 = uStack_818;
              local_200 = local_830;
              uStack_1f8 = uStack_828;
              pGVar16 = (context->scene->geometries).items[local_7d8].ptr;
              auVar145 = ZEXT3264(local_6a0);
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01408e73;
              local_580 = vandps_avx(auVar107,auVar166);
              fVar146 = (float)local_240;
              local_1c0[0] = (fVar146 + local_6a0._0_4_ + 0.0) * local_120;
              local_1c0[1] = (fVar146 + local_6a0._4_4_ + 1.0) * fStack_11c;
              local_1c0[2] = (fVar146 + local_6a0._8_4_ + 2.0) * fStack_118;
              local_1c0[3] = (fVar146 + local_6a0._12_4_ + 3.0) * fStack_114;
              fStack_1b0 = (fVar146 + local_6a0._16_4_ + 4.0) * fStack_110;
              fStack_1ac = (fVar146 + local_6a0._20_4_ + 5.0) * fStack_10c;
              fStack_1a8 = (fVar146 + local_6a0._24_4_ + 6.0) * fStack_108;
              fStack_1a4 = fVar146 + local_6a0._28_4_ + 7.0;
              local_380._0_8_ = auVar171._0_8_;
              local_380._8_8_ = auVar171._8_8_;
              local_1a0 = local_380._0_8_;
              uStack_198 = local_380._8_8_;
              uStack_190 = 0;
              uStack_188 = 0;
              local_180 = local_360;
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar107 = vblendvps_avx(auVar142,local_360,local_580);
              auVar115 = vshufps_avx(auVar107,auVar107,0xb1);
              auVar115 = vminps_avx(auVar107,auVar115);
              auVar157 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar157);
              auVar157 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar157);
              auVar115 = vcmpps_avx(auVar107,auVar115,0);
              auVar157 = local_580 & auVar115;
              auVar107 = local_580;
              if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar157 >> 0x7f,0) != '\0') ||
                    (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar157 >> 0xbf,0) != '\0') ||
                  (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar157[0x1f] < '\0') {
                auVar107 = vandps_avx(auVar115,local_580);
              }
              uVar89 = vmovmskps_avx(auVar107);
              uVar91 = 0;
              for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                uVar91 = uVar91 + 1;
              }
              uVar94 = (ulong)uVar91;
              local_380 = auVar164;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar146 = local_1c0[uVar94];
                auVar118 = ZEXT464((uint)fVar146);
                uVar97 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                fVar159 = 1.0 - fVar146;
                auVar171 = ZEXT416((uint)(fVar146 * fVar159 * 4.0));
                auVar174 = vfnmsub213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar171);
                auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar171);
                fVar159 = fVar159 * -fVar159 * 0.5;
                fVar119 = auVar174._0_4_ * 0.5;
                fVar120 = auVar171._0_4_ * 0.5;
                fVar121 = fVar146 * fVar146 * 0.5;
                auVar172._0_4_ = fVar121 * fVar19;
                auVar172._4_4_ = fVar121 * fVar82;
                auVar172._8_4_ = fVar121 * fVar83;
                auVar172._12_4_ = fVar121 * fVar84;
                auVar150._4_4_ = fVar120;
                auVar150._0_4_ = fVar120;
                auVar150._8_4_ = fVar120;
                auVar150._12_4_ = fVar120;
                auVar171 = vfmadd132ps_fma(auVar150,auVar172,auVar11);
                auVar173._4_4_ = fVar119;
                auVar173._0_4_ = fVar119;
                auVar173._8_4_ = fVar119;
                auVar173._12_4_ = fVar119;
                auVar171 = vfmadd132ps_fma(auVar173,auVar171,auVar10);
                auVar151._4_4_ = fVar159;
                auVar151._0_4_ = fVar159;
                auVar151._8_4_ = fVar159;
                auVar151._12_4_ = fVar159;
                auVar171 = vfmadd132ps_fma(auVar151,auVar171,auVar9);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar171._0_4_;
                uVar4 = vextractps_avx(auVar171,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                uVar4 = vextractps_avx(auVar171,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar4;
                *(float *)(ray + k * 4 + 0xf0) = fVar146;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar97;
                *(int *)(ray + k * 4 + 0x110) = (int)local_7e0;
                *(int *)(ray + k * 4 + 0x120) = (int)local_7d8;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_6e0._0_8_ = lVar92;
                auVar171 = *local_6f0;
                local_880 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                _local_300 = auVar103;
                while( true ) {
                  auVar107 = local_880;
                  fVar146 = local_1c0[uVar94];
                  local_3e0._4_4_ = fVar146;
                  local_3e0._0_4_ = fVar146;
                  local_3e0._8_4_ = fVar146;
                  local_3e0._12_4_ = fVar146;
                  local_3d0 = *(undefined4 *)((long)&local_1a0 + uVar94 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar94 * 4);
                  fVar119 = 1.0 - fVar146;
                  auVar174 = ZEXT416((uint)(fVar146 * fVar119 * 4.0));
                  auVar162 = vfnmsub213ss_fma(local_3e0,local_3e0,auVar174);
                  auVar174 = vfmadd213ss_fma(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),auVar174)
                  ;
                  fVar159 = auVar174._0_4_ * 0.5;
                  fVar146 = fVar146 * fVar146 * 0.5;
                  auVar175._0_4_ = fVar146 * fVar19;
                  auVar175._4_4_ = fVar146 * fVar82;
                  auVar175._8_4_ = fVar146 * fVar83;
                  auVar175._12_4_ = fVar146 * fVar84;
                  auVar152._4_4_ = fVar159;
                  auVar152._0_4_ = fVar159;
                  auVar152._8_4_ = fVar159;
                  auVar152._12_4_ = fVar159;
                  auVar174 = vfmadd132ps_fma(auVar152,auVar175,auVar11);
                  fVar146 = auVar162._0_4_ * 0.5;
                  auVar176._4_4_ = fVar146;
                  auVar176._0_4_ = fVar146;
                  auVar176._8_4_ = fVar146;
                  auVar176._12_4_ = fVar146;
                  auVar174 = vfmadd132ps_fma(auVar176,auVar174,auVar10);
                  local_7d0.context = context->user;
                  fVar146 = fVar119 * -fVar119 * 0.5;
                  auVar153._4_4_ = fVar146;
                  auVar153._0_4_ = fVar146;
                  auVar153._8_4_ = fVar146;
                  auVar153._12_4_ = fVar146;
                  auVar162 = vfmadd132ps_fma(auVar153,auVar174,auVar9);
                  local_410 = auVar162._0_4_;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  auVar174 = vshufps_avx(auVar162,auVar162,0x55);
                  local_400 = auVar174;
                  local_3f0 = vshufps_avx(auVar162,auVar162,0xaa);
                  uStack_3cc = local_3d0;
                  uStack_3c8 = local_3d0;
                  uStack_3c4 = local_3d0;
                  local_3c0 = local_2c0._0_8_;
                  uStack_3b8 = local_2c0._8_8_;
                  local_3b0._4_4_ = uStack_2ac;
                  local_3b0._0_4_ = local_2b0;
                  local_3b0._8_4_ = uStack_2a8;
                  local_3b0._12_4_ = uStack_2a4;
                  vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                  uStack_39c = (local_7d0.context)->instID[0];
                  local_3a0 = uStack_39c;
                  uStack_398 = uStack_39c;
                  uStack_394 = uStack_39c;
                  uStack_390 = (local_7d0.context)->instPrimID[0];
                  uStack_38c = uStack_390;
                  uStack_388 = uStack_390;
                  uStack_384 = uStack_390;
                  local_7d0.valid = (int *)local_7f0;
                  local_7d0.geometryUserPtr = pGVar16->userPtr;
                  local_7d0.hit = (RTCHitN *)&local_410;
                  local_7d0.N = 4;
                  local_7f0 = auVar171;
                  local_7d0.ray = (RTCRayN *)ray;
                  if (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar220 = ZEXT1664(auVar220._0_16_);
                    (*pGVar16->intersectionFilterN)(&local_7d0);
                  }
                  if (local_7f0 == (undefined1  [16])0x0) {
                    auVar174 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar162 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                    auVar174 = auVar174 ^ auVar162;
                  }
                  else {
                    p_Var18 = context->args->filter;
                    auVar162 = vpcmpeqd_avx(auVar174,auVar174);
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar220 = ZEXT1664(auVar220._0_16_);
                      (*p_Var18)(&local_7d0);
                      auVar162 = vpcmpeqd_avx(auVar162,auVar162);
                    }
                    auVar7 = vpcmpeqd_avx(local_7f0,_DAT_01f45a50);
                    auVar174 = auVar7 ^ auVar162;
                    if (local_7f0 != (undefined1  [16])0x0) {
                      auVar7 = auVar7 ^ auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])local_7d0.hit);
                      *(undefined1 (*) [16])(local_7d0.ray + 0xc0) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0xd0) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0xe0) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0xf0) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0x100) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0x110) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0x120) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0x130) = auVar162;
                      auVar162 = vmaskmovps_avx(auVar7,*(undefined1 (*) [16])(local_7d0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_7d0.ray + 0x140) = auVar162;
                    }
                  }
                  auVar164 = local_360;
                  auVar126._8_8_ = 0x100000001;
                  auVar126._0_8_ = 0x100000001;
                  if ((auVar126 & auVar174) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_880._0_4_;
                  }
                  else {
                    local_880._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_880._4_4_ = 0;
                    local_880._8_4_ = 0;
                    local_880._12_4_ = 0;
                  }
                  *(undefined4 *)(local_580 + uVar94 * 4) = 0;
                  local_880._16_16_ = auVar107._16_16_;
                  auVar116._4_4_ = local_880._0_4_;
                  auVar116._0_4_ = local_880._0_4_;
                  auVar116._8_4_ = local_880._0_4_;
                  auVar116._12_4_ = local_880._0_4_;
                  auVar116._16_4_ = local_880._0_4_;
                  auVar116._20_4_ = local_880._0_4_;
                  auVar116._24_4_ = local_880._0_4_;
                  auVar116._28_4_ = local_880._0_4_;
                  auVar115 = vcmpps_avx(auVar164,auVar116,2);
                  auVar107 = vandps_avx(auVar115,local_580);
                  auVar118 = ZEXT3264(auVar107);
                  local_580 = local_580 & auVar115;
                  if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_580 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_580 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_580 >> 0x7f,0) == '\0') &&
                        (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_580 >> 0xbf,0) == '\0') &&
                      (local_580 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_580[0x1f]) break;
                  auVar143._8_4_ = 0x7f800000;
                  auVar143._0_8_ = 0x7f8000007f800000;
                  auVar143._12_4_ = 0x7f800000;
                  auVar143._16_4_ = 0x7f800000;
                  auVar143._20_4_ = 0x7f800000;
                  auVar143._24_4_ = 0x7f800000;
                  auVar143._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar143,auVar164,auVar107);
                  auVar115 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar115 = vminps_avx(auVar164,auVar115);
                  auVar157 = vshufpd_avx(auVar115,auVar115,5);
                  auVar115 = vminps_avx(auVar115,auVar157);
                  auVar157 = vpermpd_avx2(auVar115,0x4e);
                  auVar115 = vminps_avx(auVar115,auVar157);
                  auVar115 = vcmpps_avx(auVar164,auVar115,0);
                  auVar157 = auVar107 & auVar115;
                  auVar164 = auVar107;
                  if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar157 >> 0x7f,0) != '\0') ||
                        (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar157 >> 0xbf,0) != '\0') ||
                      (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar157[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar115,auVar107);
                  }
                  uVar89 = vmovmskps_avx(auVar164);
                  uVar91 = 0;
                  for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                    uVar91 = uVar91 + 1;
                  }
                  uVar94 = (ulong)uVar91;
                  local_580 = auVar107;
                }
                auVar199 = ZEXT3264(local_760);
                auVar207 = ZEXT3264(local_660);
                lVar92 = local_6e0._0_8_;
              }
            }
            auVar145 = ZEXT3264(local_6a0);
            fVar146 = (float)local_620;
            fVar159 = local_620._4_4_;
            fVar119 = (float)uStack_618;
            fVar120 = uStack_618._4_4_;
            fVar121 = (float)uStack_610;
            fVar122 = uStack_610._4_4_;
            fVar123 = (float)uStack_608;
            uVar97 = uStack_608._4_4_;
          }
        }
LAB_01408e73:
        auVar167 = ZEXT3264(local_5a0);
      }
    }
    uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar112._4_4_ = uVar97;
    auVar112._0_4_ = uVar97;
    auVar112._8_4_ = uVar97;
    auVar112._12_4_ = uVar97;
    auVar112._16_4_ = uVar97;
    auVar112._20_4_ = uVar97;
    auVar112._24_4_ = uVar97;
    auVar112._28_4_ = uVar97;
    auVar107 = vcmpps_avx(local_80,auVar112,2);
    uVar91 = vmovmskps_avx(auVar107);
    uVar90 = (ulong)((uint)uVar90 & (uint)uVar90 + 0xff & uVar91);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }